

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_t *psVar3;
  ptls_iovec_t *name;
  st_ptls_aead_algorithm_t *psVar4;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t *p_Var5;
  st_ptls_aead_algorithm_t *end;
  uint8_t uVar6;
  uint8_t uVar7;
  undefined1 uVar8;
  uint16_t group;
  en_ptls_state_t eVar9;
  uint32_t uVar10;
  st_ptls_on_extension_t *psVar11;
  short *psVar12;
  st_ptls_on_client_hello_t *psVar13;
  char *pcVar14;
  ptls_esni_context_t *ppVar15;
  st_ptls_get_time_t *psVar16;
  _func_uint64_t_st_ptls_get_time_t_ptr *p_Var17;
  st_ptls_encrypt_ticket_t *psVar18;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var19;
  ptls_key_exchange_algorithm_t *ppVar20;
  ptls_key_exchange_algorithm_t *negotiated_group;
  _func_int_st_ptls_message_emitter_t_ptr *p_Var21;
  _func_void_void_ptr_size_t *p_Var22;
  _func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
  *p_Var23;
  st_ptls_update_esni_key_t *psVar24;
  void *pvVar25;
  st_ptls_update_traffic_key_t *psVar26;
  _func_int_st_ptls_update_traffic_key_t_ptr_ptls_t_ptr_int_size_t_void_ptr *p_Var27;
  ptls_esni_secret_t *ppVar28;
  ptls_verify_certificate_t *vc;
  _func_st_ptls_hash_context_t_ptr_st_ptls_hash_context_t_ptr *p_Var29;
  ptls_key_schedule_t *sched;
  char *__s;
  st_ptls_hash_context_t *psVar30;
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_ptls_hash_final_mode_t *p_Var31;
  undefined8 uVar32;
  ushort uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ptls_iovec_t pVar36;
  ptls_iovec_t ikm;
  st_ptls_aead_algorithm_t **ppsVar37;
  undefined1 auVar38 [8];
  st_ptls_signature_algorithms_t *signature_algorithms;
  bool bVar39;
  ushort uVar40;
  short sVar41;
  short sVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  ushort *__dest;
  code *pcVar47;
  st_ptls_aead_algorithm_t *psVar48;
  uint8_t *puVar49;
  ptls_cipher_suite_t *ppVar50;
  st_ptls_aead_algorithm_t *psVar51;
  uint8_t *puVar52;
  st_ptls_aead_algorithm_t *psVar53;
  size_t sVar54;
  ptls_esni_secret_t **esni;
  ptls_key_schedule_t *ppVar55;
  uint64_t uVar56;
  ptls_key_exchange_algorithm_t **pppVar57;
  ushort *puVar58;
  uint8_t *puVar59;
  st_ptls_extension_bitmap_t sVar60;
  st_ptls_hash_context_t *psVar61;
  uint8_t auVar62 [8];
  ptls_context_t *ppVar63;
  byte bVar64;
  _func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *msglen;
  code *pcVar65;
  ulong uVar66;
  long lVar67;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t *msg;
  ulong uVar68;
  st_ptls_aead_algorithm_t *psVar69;
  ulong *puVar70;
  long lVar71;
  st_ptls_aead_algorithm_t *psVar72;
  size_t sVar73;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *secret;
  size_t *psVar74;
  uint8_t *puVar75;
  uint8_t *puVar76;
  uint8_t *puVar77;
  uint8_t *puVar78;
  uint8_t *puVar79;
  uint8_t *puVar80;
  uint8_t *puVar81;
  uint8_t *puVar82;
  uint8_t *puVar83;
  uint8_t *puVar84;
  uint8_t *puVar85;
  uint8_t *puVar86;
  uint8_t *puVar87;
  uint8_t *puVar88;
  uint8_t *puVar89;
  uint8_t *puVar90;
  uint8_t *puVar91;
  uint8_t *puVar92;
  uint8_t *puVar93;
  uint8_t *puVar94;
  uint8_t *puVar95;
  uint8_t *puVar96;
  uint8_t *puVar97;
  uint8_t *puVar98;
  uint8_t *puVar99;
  uint8_t *puVar100;
  uint8_t *puVar101;
  uint8_t *puVar102;
  uint8_t *puVar103;
  uint8_t *puVar104;
  uint8_t *puVar105;
  uint8_t *puVar106;
  uint8_t *puVar107;
  uint8_t *puVar108;
  uint8_t *puVar109;
  uint8_t *puVar110;
  uint8_t *puVar111;
  uint8_t *puVar112;
  uint8_t *puVar113;
  uint8_t *puVar114;
  uint8_t *puVar115;
  uint8_t *puVar116;
  uint8_t *puVar117;
  uint8_t *puVar118;
  uint8_t *puVar119;
  uint8_t *puVar120;
  uint8_t *puVar121;
  uint8_t *puVar122;
  uint8_t *puVar123;
  uint8_t *puVar124;
  ptls_cipher_suite_t **pppVar125;
  ushort *puVar126;
  ptls_buffer_t *ppVar127;
  uint16_t *puVar128;
  undefined1 *puVar129;
  size_t sVar130;
  size_t sVar131;
  long lVar132;
  size_t sVar133;
  ptls_buffer_t *_buf;
  ptls_buffer_t *ppVar134;
  bool bVar135;
  ptls_iovec_t pVar136;
  ptls_iovec_t pVar137;
  ptls_iovec_t pVar138;
  ptls_iovec_t pVar139;
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ptls_iovec_t ikm_00;
  size_t sStack_770;
  uint8_t local_768 [864];
  undefined1 local_408 [416];
  st_ptls_aead_algorithm_t *psStack_268;
  ptls_cipher_suite_t *cs;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t *local_258;
  _func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *p_Stack_250;
  ptls_iovec_t *local_248;
  _func_size_t_st_ptls_aead_context_t_ptr_void_ptr *local_240;
  st_ptls_signature_algorithms_t *local_238;
  _func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
  *p_Stack_230;
  ushort *local_228;
  size_t sStack_220;
  ushort *local_218;
  size_t sStack_210;
  ushort *local_208;
  size_t sStack_200;
  byte local_1f8;
  ptls_hash_algorithm_t *local_1e0;
  undefined1 local_1d8 [8];
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t pubkey;
  ptls_key_exchange_algorithm_t *ppStack_188;
  anon_struct_24_2_cc7b932a key_share;
  undefined1 auStack_168 [8];
  ptls_iovec_t ecdh_secret;
  undefined2 local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  undefined2 local_144;
  ushort local_142;
  ushort local_140;
  ushort local_13e;
  ushort local_13c;
  undefined2 local_13a;
  ushort local_138;
  ushort local_136;
  ushort local_134;
  undefined2 local_132;
  undefined2 local_130;
  ushort local_12e;
  ushort local_12c;
  ushort local_12a;
  undefined2 local_128;
  ushort local_126;
  ushort local_124;
  ushort local_122;
  undefined2 local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  undefined2 local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ulong *local_108;
  uint8_t local_100;
  uint8_t uStack_ff;
  uint8_t uStack_fe;
  uint8_t uStack_fd;
  uint8_t uStack_fc;
  uint8_t uStack_fb;
  uint8_t uStack_fa;
  uint8_t uStack_f9;
  st_ptls_extension_bitmap_t bitmap;
  undefined8 local_f0;
  uint64_t issue_at;
  ptls_esni_secret_t *local_e0;
  st_ptls_signature_algorithms_t *local_d8;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  uint32_t local_bc;
  ptls_iovec_t *ppStack_b8;
  uint32_t age_add;
  uint16_t local_ac;
  uint16_t local_aa;
  undefined1 auStack_a8 [4];
  uint16_t ticket_key_exchange_id;
  uint16_t ticket_csid;
  ptls_buffer_t session_id;
  size_t local_80;
  st_ptls_aead_algorithm_t *local_70;
  size_t local_68;
  ptls_esni_context_t **local_60;
  st_ptls_aead_algorithm_t *local_58;
  size_t tbs_start;
  st_ptls_aead_algorithm_t *local_48;
  ptls_message_emitter_t *_emitter;
  
  msglen = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)message.len;
  msg = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t *)message.base;
  puVar59 = local_768;
  puVar107 = local_768;
  key_share.peer_key.base = (uint8_t *)0x0;
  ppStack_188 = (ptls_key_exchange_algorithm_t *)0x0;
  key_share.algorithm = (ptls_key_exchange_algorithm_t *)0x0;
  ticket_negotiated_protocol.len = 0;
  auStack_168 = (undefined1  [8])0x0;
  ecdh_secret.base = (uint8_t *)0x0;
  eVar9 = tls->state;
  sStack_770 = 0x10eed9;
  __dest = (ushort *)malloc(0x500);
  puVar75 = local_768;
  iVar44 = 0x201;
  if (__dest == (ushort *)0x0) goto LAB_0010efba;
  sStack_770 = 0x10ef01;
  memset(local_768,0,0x500);
  sStack_770 = 0x10ef19;
  memcpy(local_408,&DAT_0012eaa8,0x198);
  sStack_770 = 0x10ef29;
  memcpy(__dest,local_768,0x500);
  sStack_770 = 0x32;
  iVar44 = 0x32;
  puVar75 = local_768;
  if ((long)msglen < 6) goto LAB_0010efba;
  uVar40 = *(ushort *)(msg + 4) << 8 | *(ushort *)(msg + 4) >> 8;
  *__dest = uVar40;
  if (uVar40 < 0x301) goto LAB_0010ef4a;
  psVar4 = (st_ptls_aead_algorithm_t *)(msg + (long)msglen);
  puVar75 = local_768;
  if (((msglen < (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x26) ||
      (*(_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t **)(__dest + 4) = msg + 6,
      puVar75 = local_768,
      msglen == (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x26)) ||
     (pcVar65 = (code *)(ulong)(byte)msg[0x26], puVar75 = local_768,
     msglen + -0x27 < pcVar65 || (code *)0x20 < pcVar65)) goto LAB_0010efba;
  p_Var5 = msg + (long)pcVar65;
  *(_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t **)(__dest + 8) = msg + 0x27;
  *(code **)(__dest + 0xc) = pcVar65;
  puVar75 = local_768;
  if ((ulong)((long)psVar4 - (long)(p_Var5 + 0x27)) < 2) goto LAB_0010efba;
  uVar40 = *(ushort *)(p_Var5 + 0x27);
  pcVar47 = p_Var5 + 0x29;
  uVar68 = (ulong)(ushort)(uVar40 << 8 | uVar40 >> 8);
  puVar75 = local_768;
  if ((ulong)((long)psVar4 - (long)pcVar47) < uVar68) goto LAB_0010efba;
  *(code **)(__dest + 0x1c) = pcVar47;
  psVar48 = (st_ptls_aead_algorithm_t *)(pcVar47 + uVar68);
  *(ulong *)(__dest + 0x20) = uVar68;
  uVar66 = 0x208;
  do {
    puVar75 = local_768;
    if ((long)uVar68 < 2) goto LAB_0010efba;
    uVar40 = *(ushort *)(pcVar65 + (long)msg + (uVar66 - 0x1df));
    *(ushort *)((long)__dest + uVar66) = uVar40 << 8 | uVar40 >> 8;
    *(long *)(__dest + 0x124) = *(long *)(__dest + 0x124) + 1;
    if (0x245 < uVar66) break;
    lVar67 = uVar66 - 0x1dd;
    uVar68 = uVar68 - 2;
    uVar66 = uVar66 + 2;
  } while ((st_ptls_aead_algorithm_t *)(pcVar65 + (long)msg + lVar67) != psVar48);
  puVar75 = local_768;
  if (psVar48 == psVar4) goto LAB_0010efba;
  uVar68 = (ulong)*(byte *)&psVar48->name;
  puVar49 = (uint8_t *)((long)&psVar48->name + 1);
  puVar75 = local_768;
  if ((ulong)((long)psVar4 - (long)puVar49) < uVar68 || uVar68 == 0) goto LAB_0010efba;
  *(uint8_t **)(__dest + 0x10) = puVar49;
  puVar49 = puVar49 + uVar68;
  local_100 = '\0';
  uStack_ff = '\0';
  uStack_fe = '\0';
  uStack_fd = '\0';
  uStack_fc = '\0';
  uStack_fb = '\0';
  uStack_fa = '\0';
  uStack_f9 = '\0';
  *(ulong *)(__dest + 0x14) = uVar68;
  puVar75 = local_768;
  if ((ulong)((long)psVar4 - (long)puVar49) < 2) goto LAB_0010efba;
  _auStack_a8 = (st_ptls_aead_algorithm_t *)(puVar49 + 2);
  puVar75 = local_768;
  if ((ulong)((long)psVar4 - (long)_auStack_a8) < (ulong)CONCAT11(*puVar49,puVar49[1]))
  goto LAB_0010efba;
  psVar69 = (st_ptls_aead_algorithm_t *)
            ((long)&_auStack_a8->name + (ulong)CONCAT11(*puVar49,puVar49[1]));
  session_id._24_8_ = __dest + 0x150;
  local_d8 = (st_ptls_signature_algorithms_t *)(__dest + 0x34);
  ppStack_b8 = (ptls_iovec_t *)(__dest + 0x6c);
  issue_at = (uint64_t)(__dest + 0x54);
  local_e0 = (ptls_esni_secret_t *)(__dest + 0x58);
  name = (ptls_iovec_t *)(__dest + 0x48);
  local_108 = (ulong *)(__dest + 0x160);
  sStack_770 = 0x32;
  iVar45 = 0x32;
  psVar48 = _auStack_a8;
LAB_0010f162:
  _auStack_a8 = psVar48;
  if (psVar48 == psVar69) goto LAB_0010fbad;
  puVar75 = local_768;
  iVar44 = iVar45;
  if ((long)psVar69 - (long)psVar48 < 2) goto LAB_0010efba;
  uVar40 = *(ushort *)&psVar48->name << 8 | *(ushort *)&psVar48->name >> 8;
  if ((uVar40 < 0x40) && (((&bitmap)[-1].bits[uVar40 >> 3] >> (uVar40 & 7) & 1) != 0)) {
LAB_0010fba6:
    psVar74 = &sStack_770;
    sStack_770 = 0x2f;
    goto LAB_0010ef4c;
  }
  sStack_770 = 0x10f1c3;
  extension_bitmap_set((st_ptls_extension_bitmap_t *)&stack0xffffffffffffff00,uVar40);
  puVar75 = local_768;
  if ((ulong)((long)psVar69 - (long)((long)&psVar48->name + 2)) < 2) goto LAB_0010efba;
  psVar53 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 4);
  _auStack_a8 = psVar53;
  uVar33 = CONCAT11(*(uint8_t *)((long)&psVar48->name + 2),*(uint8_t *)((long)&psVar48->name + 3));
  uVar68 = (ulong)uVar33;
  puVar75 = local_768;
  if ((ulong)((long)psVar69 - (long)psVar53) < uVar68) goto LAB_0010efba;
  *(byte *)(__dest + 0x1a6) = (byte)__dest[0x1a6] & 0xfd;
  psVar11 = tls->ctx->on_extension;
  if (psVar11 != (st_ptls_on_extension_t *)0x0) {
    sStack_770 = 0x10f23b;
    pVar137.len._0_2_ = uVar33;
    pVar137.base = (uint8_t *)psVar53;
    pVar137.len._2_6_ = 0;
    iVar43 = (*psVar11->cb)(psVar11,tls,'\x01',uVar40,pVar137);
    if (iVar43 != 0) {
      psVar74 = &sStack_770;
      sStack_770 = 1;
      goto LAB_0010ef4c;
    }
  }
  end = (st_ptls_aead_algorithm_t *)((long)&psVar53->name + uVar68);
  switch(uVar40) {
  case 0x29:
    puVar75 = local_768;
    if (uVar33 < 2) goto LAB_0010efba;
    _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 6);
    uVar68 = (ulong)CONCAT11(*(uint8_t *)((long)&psVar48->name + 4),
                             *(uint8_t *)((long)&psVar48->name + 5));
    puVar75 = local_768;
    if ((ulong)((long)end - (long)_auStack_a8) < uVar68) goto LAB_0010efba;
    psVar48 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
    sStack_770 = 1;
    lVar67 = 1;
    do {
      local_48 = (st_ptls_aead_algorithm_t *)lVar67;
      local_258 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_size_t *)0x0;
      p_Stack_250 = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
      local_248 = (ptls_iovec_t *)0x0;
      psStack_268 = (st_ptls_aead_algorithm_t *)0x0;
      cs = (ptls_cipher_suite_t *)0x0;
      puVar75 = local_768;
      iVar44 = iVar45;
      if ((ulong)((long)psVar48 - (long)_auStack_a8) < 2) goto LAB_0010efba;
      psVar53 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + 2);
      ppVar50 = (ptls_cipher_suite_t *)
                (ulong)CONCAT11(*(uint8_t *)&_auStack_a8->name,
                                *(uint8_t *)((long)&_auStack_a8->name + 1));
      puVar75 = local_768;
      _auStack_a8 = psVar53;
      if ((ptls_cipher_suite_t *)((long)psVar48 - (long)psVar53) < ppVar50) goto LAB_0010efba;
      _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar53->name + (long)ppVar50);
      sStack_770 = 0x10f3c8;
      psStack_268 = psVar53;
      cs = ppVar50;
      iVar44 = ptls_decode32((uint32_t *)&stack0xfffffffffffffda8,(uint8_t **)auStack_a8,
                             (uint8_t *)psVar48);
      puVar75 = local_768;
      if (iVar44 != 0) goto LAB_0010efba;
      uVar68 = *(ulong *)(__dest + 0x1a0);
      if (uVar68 < 4) {
        *(ulong *)(__dest + 0x1a0) = uVar68 + 1;
        lVar67 = uVar68 * 0x28;
        *(ptls_iovec_t **)(session_id._24_8_ + 0x20 + lVar67) = local_248;
        puVar1 = (undefined8 *)(session_id._24_8_ + 0x10 + lVar67);
        *puVar1 = local_258;
        puVar1[1] = p_Stack_250;
        *(long *)(session_id._24_8_ + lVar67) = (long)psStack_268;
        ((long *)(session_id._24_8_ + lVar67))[1] = (long)cs;
      }
      lVar67 = (long)local_48 + 1;
    } while (_auStack_a8 != psVar48);
    *(st_ptls_aead_algorithm_t **)(__dest + 0x14c) = _auStack_a8;
    puVar75 = local_768;
    iVar44 = iVar45;
    if ((ulong)((long)end - (long)psVar48) < 2) goto LAB_0010efba;
    psVar48 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + 2);
    uVar68 = (ulong)(ushort)(*(ushort *)&_auStack_a8->name << 8 | *(ushort *)&_auStack_a8->name >> 8
                            );
    puVar75 = local_768;
    if ((ulong)((long)end - (long)psVar48) < uVar68) goto LAB_0010efba;
    psVar53 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + uVar68);
    uVar68 = 0;
    puVar70 = local_108;
    do {
      puVar75 = local_768;
      if (psVar53 == psVar48) goto LAB_0010efba;
      uVar66 = (ulong)*(byte *)&psVar48->name;
      puVar49 = (uint8_t *)((long)&psVar48->name + 1);
      puVar75 = local_768;
      if ((ulong)((long)psVar53 - (long)puVar49) < uVar66) goto LAB_0010efba;
      if (uVar68 < *(ulong *)(__dest + 0x1a0)) {
        puVar70[-1] = (ulong)puVar49;
        *puVar70 = uVar66;
      }
      psVar48 = (st_ptls_aead_algorithm_t *)(puVar49 + uVar66);
      uVar68 = uVar68 + 1;
      local_48 = (st_ptls_aead_algorithm_t *)((long)local_48 + -1);
      puVar70 = puVar70 + 5;
    } while (psVar48 != psVar53);
    _auStack_a8 = psVar53;
    if (local_48 != (st_ptls_aead_algorithm_t *)0x0) goto LAB_0010fba6;
    puVar75 = local_768;
    if (psVar53 != end) goto LAB_0010efba;
    *(byte *)(__dest + 0x1a6) = (byte)__dest[0x1a6] | 2;
    break;
  case 0x2a:
    *(byte *)(__dest + 0x1a6) = (byte)__dest[0x1a6] | 1;
    break;
  case 0x2b:
    puVar75 = local_768;
    if (uVar68 != 0) {
      _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 5);
      uVar68 = (ulong)*(byte *)((long)&psVar48->name + 4);
      puVar75 = local_768;
      if (uVar68 <= (ulong)((long)end - (long)_auStack_a8)) {
        psVar53 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
        sStack_770 = 4;
        lVar67 = 4;
        do {
          puVar75 = local_768;
          if ((long)psVar53 - (long)_auStack_a8 < 2) goto LAB_0010efba;
          ppsVar37 = (st_ptls_aead_algorithm_t **)&_auStack_a8->name;
          _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + 2);
          lVar132 = 0;
          for (puVar128 = supported_versions;
              (lVar71 = lVar67, lVar67 != lVar132 &&
              (lVar71 = lVar132,
              *puVar128 != (uint16_t)(*(ushort *)ppsVar37 << 8 | *(ushort *)ppsVar37 >> 8)));
              puVar128 = puVar128 + 1) {
            lVar132 = lVar132 + 1;
          }
          lVar67 = lVar71;
        } while (_auStack_a8 != psVar53);
        if (lVar71 != 4) {
          __dest[0x18] = supported_versions[lVar71];
        }
        goto LAB_0010fb1a;
      }
    }
    goto LAB_0010efba;
  case 0x2c:
    if ((properties == (ptls_handshake_properties_t *)0x0) ||
       ((properties->field_0).server.cookie.key == (void *)0x0)) goto LAB_0010fba6;
    *(st_ptls_aead_algorithm_t **)(__dest + 0x128) = psVar53;
    *(ulong *)(__dest + 300) = uVar68;
    puVar75 = local_768;
    if (1 < uVar68) {
      psVar53 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 6);
      uVar68 = (ulong)CONCAT11(*(uint8_t *)((long)&psVar48->name + 4),
                               *(uint8_t *)((long)&psVar48->name + 5));
      puVar75 = local_768;
      _auStack_a8 = psVar53;
      if ((uVar68 <= (ulong)((long)end - (long)psVar53)) &&
         (*(st_ptls_aead_algorithm_t **)(__dest + 0x130) = psVar53, puVar75 = local_768, 1 < uVar68)
         ) {
        psVar51 = (st_ptls_aead_algorithm_t *)((long)&psVar53->name + uVar68);
        _auStack_a8 = (st_ptls_aead_algorithm_t *)&psVar48->confidentiality_limit;
        uVar68 = (ulong)CONCAT11(*(uint8_t *)((long)&psVar48->name + 6),
                                 *(uint8_t *)((long)&psVar48->name + 7));
        puVar75 = local_768;
        if ((uVar68 <= (ulong)((long)psVar51 - (long)_auStack_a8)) &&
           (puVar75 = local_768, uVar68 != 0)) {
          psVar72 = (st_ptls_aead_algorithm_t *)
                    ((long)&((ptls_iovec_t *)_auStack_a8)->base + uVar68);
          uVar68 = (ulong)*(byte *)&((ptls_iovec_t *)&psVar48->confidentiality_limit)->base;
          puVar129 = (undefined1 *)
                     ((long)&((ptls_iovec_t *)&psVar48->confidentiality_limit)->base + 1);
          puVar75 = local_768;
          if (uVar68 <= (ulong)((long)psVar72 - (long)puVar129)) {
            *(undefined1 **)(__dest + 0x138) = puVar129;
            psVar48 = (st_ptls_aead_algorithm_t *)(puVar129 + uVar68);
            *(ulong *)(__dest + 0x13c) = uVar68;
            puVar75 = local_768;
            if (psVar48 != psVar72) {
              _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 1);
              if (*(uint8_t *)&psVar48->name == '\x01') {
                *(byte *)(__dest + 0x148) = (byte)__dest[0x148] | 1;
              }
              else {
                puVar75 = local_768;
                if (*(uint8_t *)&psVar48->name != '\0') goto LAB_0010efba;
                if ((__dest[0x148] & 1) != 0) {
                  sStack_770 = 0x1112c3;
                  __assert_fail("!ch->cookie.sent_key_share",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                ,0xd47,
                                "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                               );
                }
              }
              puVar75 = local_768;
              if ((_auStack_a8 == psVar72) &&
                 (*(long *)(__dest + 0x134) = (long)psVar72 - (long)psVar53, puVar75 = local_768,
                 psVar51 != psVar72)) {
                _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 2);
                uVar68 = (ulong)*(byte *)&psVar72->name;
                puVar75 = local_768;
                if (uVar68 <= (ulong)((long)psVar51 - (long)_auStack_a8)) {
                  *(st_ptls_aead_algorithm_t **)(__dest + 0x140) = _auStack_a8;
                  _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
                  *(ulong *)(__dest + 0x144) = uVar68;
                  puVar75 = local_768;
                  if (_auStack_a8 == psVar51) {
                    bVar135 = _auStack_a8 == end;
                    goto LAB_0010fb8c;
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_0010efba;
  case 0x2d:
    puVar75 = local_768;
    if (uVar68 == 0) goto LAB_0010efba;
    _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 5);
    uVar68 = (ulong)*(byte *)((long)&psVar48->name + 4);
    puVar75 = local_768;
    if (((ulong)((long)end - (long)_auStack_a8) < uVar68) || (puVar75 = local_768, uVar68 == 0))
    goto LAB_0010efba;
    psVar53 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
    sStack_770 = 1;
    psVar48 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 6);
    for (; psVar51 = psVar48, uVar68 != 0; uVar68 = uVar68 - 1) {
      bVar64 = *(byte *)((long)&psVar51[-1].setup_crypto + 7);
      if (bVar64 < 0x20) {
        *(uint *)(__dest + 0x1a4) = *(uint *)(__dest + 0x1a4) | 1 << (bVar64 & 0x1f);
      }
      psVar48 = (st_ptls_aead_algorithm_t *)((long)&psVar51->name + 1);
      _auStack_a8 = psVar51;
    }
LAB_0010fb1a:
    bVar135 = psVar53 == end;
    goto LAB_0010fb8c;
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
switchD_0010f2e6_caseD_2e:
    sStack_770 = 0x10f4ef;
    psVar48 = psVar53;
    iVar44 = should_collect_unknown_extension(tls,properties,uVar40);
    if (iVar44 != 0) {
      sStack_770 = 0x10f51a;
      iVar44 = collect_unknown_extension
                         ((ptls_t *)(ulong)uVar40,(uint16_t)psVar53,(uint8_t *)end,
                          (uint8_t *)(__dest + 0x1b0),(ptls_raw_extension_t *)psVar48);
joined_r0x0010f90d:
      puVar75 = local_768;
      if (iVar44 != 0) goto LAB_0010efba;
    }
    break;
  case 0x33:
    *(st_ptls_aead_algorithm_t **)(__dest + 0x2c) = psVar53;
    *(ulong *)(__dest + 0x30) = uVar68;
    break;
  default:
    if (uVar40 == 0xffce) {
      if (*(long *)(__dest + 0x50) != 0) goto LAB_0010fba6;
      puVar75 = local_768;
      if (uVar33 < 2) goto LAB_0010efba;
      uVar40 = *(ushort *)((long)&psVar48->name + 4);
      _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 6);
      pppVar125 = tls->ctx->cipher_suites;
      while( true ) {
        if (*pppVar125 == (ptls_cipher_suite_t *)0x0) goto LAB_0010fba6;
        if ((*pppVar125)->id == (uint16_t)(uVar40 << 8 | uVar40 >> 8)) break;
        pppVar125 = pppVar125 + 1;
      }
      sStack_770 = 0x10f9e7;
      iVar44 = select_key_share((ptls_key_exchange_algorithm_t **)issue_at,&local_e0->secret,
                                tls->ctx->key_exchanges,(uint8_t **)auStack_a8,(uint8_t *)end,1);
      puVar75 = local_768;
      if ((iVar44 != 0) ||
         (puVar75 = local_768, iVar44 = iVar45, (ulong)((long)end - (long)_auStack_a8) < 2))
      goto LAB_0010efba;
      puVar58 = (ushort *)((long)&_auStack_a8->name + 2);
      uVar68 = (ulong)(ushort)(*(ushort *)&_auStack_a8->name << 8 |
                              *(ushort *)&_auStack_a8->name >> 8);
      puVar75 = local_768;
      if ((ulong)((long)end - (long)puVar58) < uVar68) goto LAB_0010efba;
      if (uVar68 == (*pppVar125)->hash->digest_size) {
        puVar49 = (uint8_t *)((long)&_auStack_a8->name + uVar68 + 2);
        *(ushort **)(__dest + 0x60) = puVar58;
        puVar75 = local_768;
        if ((ulong)((long)end - (long)puVar49) < 2) goto LAB_0010efba;
        uVar40 = *(ushort *)((long)&_auStack_a8->name + uVar68 + 2);
        puVar52 = (uint8_t *)((long)&_auStack_a8->name + uVar68 + 4);
        uVar68 = (ulong)(ushort)(uVar40 << 8 | uVar40 >> 8);
        puVar75 = local_768;
        if ((ulong)((long)end - (long)puVar52) < uVar68) goto LAB_0010efba;
        if ((*pppVar125)->aead->tag_size <= uVar68) {
          *(uint8_t **)(__dest + 100) = puVar52;
          *(ulong *)(__dest + 0x68) = uVar68;
          puVar75 = local_768;
          if ((st_ptls_aead_algorithm_t *)(puVar49 + uVar68 + 2) == end) {
            *(ptls_cipher_suite_t **)(__dest + 0x50) = *pppVar125;
            break;
          }
          goto LAB_0010efba;
        }
      }
      goto LAB_0010fba6;
    }
    if (uVar40 == 5) {
      *(byte *)(__dest + 0x27c) = (byte)__dest[0x27c] | 1;
      break;
    }
    if (uVar40 == 10) {
      *(st_ptls_aead_algorithm_t **)(__dest + 0x24) = psVar53;
      *(ulong *)(__dest + 0x28) = uVar68;
      break;
    }
    if (uVar40 == 0xd) {
      sStack_770 = 0x10f8ff;
      iVar44 = decode_signature_algorithms(local_d8,(uint8_t **)auStack_a8,(uint8_t *)end);
      goto joined_r0x0010f90d;
    }
    if (uVar40 == 0x10) {
      puVar75 = local_768;
      if (uVar33 < 2) goto LAB_0010efba;
      _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 6);
      uVar68 = (ulong)CONCAT11(*(uint8_t *)((long)&psVar48->name + 4),
                               *(uint8_t *)((long)&psVar48->name + 5));
      puVar75 = local_768;
      if ((ulong)((long)end - (long)_auStack_a8) < uVar68) goto LAB_0010efba;
      psVar53 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
      do {
        puVar75 = local_768;
        if (psVar53 == _auStack_a8) goto LAB_0010efba;
        psVar48 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + 1);
        uVar68 = (ulong)*(byte *)&_auStack_a8->name;
        puVar75 = local_768;
        _auStack_a8 = psVar48;
        if (((ulong)((long)psVar53 - (long)psVar48) < uVar68) || (puVar75 = local_768, uVar68 == 0))
        goto LAB_0010efba;
        uVar66 = *(ulong *)(__dest + 0xec);
        if (uVar66 < 0x10) {
          *(ulong *)(__dest + 0xec) = uVar66 + 1;
          ppStack_b8[uVar66].base = (uint8_t *)psVar48;
          ppStack_b8[uVar66].len = uVar68;
        }
        _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + uVar68);
      } while (_auStack_a8 != psVar53);
      goto LAB_0010fb1a;
    }
    if (uVar40 == 0x14) {
      puVar75 = local_768;
      if (uVar68 != 0) {
        _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 5);
        bVar64 = *(byte *)((long)&psVar48->name + 4);
        uVar68 = (ulong)bVar64;
        puVar75 = local_768;
        if (uVar68 <= (ulong)((long)end - (long)_auStack_a8)) {
          if (uVar68 == 1) {
            bVar64 = *(byte *)&_auStack_a8->name;
          }
          puVar75 = local_768;
          if (bVar64 != 0) {
            psVar53 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
            psVar48 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 6);
            do {
              _auStack_a8 = psVar48;
              uVar66 = *(ulong *)(__dest + 0x1ac);
              if (uVar66 < 8) {
                uVar8 = *(undefined1 *)((long)&_auStack_a8[-1].setup_crypto + 7);
                *(ulong *)(__dest + 0x1ac) = uVar66 + 1;
                *(undefined1 *)((long)__dest + uVar66 + 0x350) = uVar8;
              }
              uVar68 = uVar68 - 1;
              psVar48 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + 1);
            } while (uVar68 != 0);
            goto LAB_0010fb1a;
          }
        }
      }
      goto LAB_0010efba;
    }
    if (uVar40 == 0x1b) {
      puVar75 = local_768;
      if (uVar68 != 0) {
        _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&psVar48->name + 5);
        uVar68 = (ulong)*(byte *)((long)&psVar48->name + 4);
        puVar75 = local_768;
        if (uVar68 <= (ulong)((long)end - (long)_auStack_a8)) {
          psVar48 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + uVar68);
          do {
            puVar75 = local_768;
            if ((long)uVar68 < 2) goto LAB_0010efba;
            uVar6 = *(uint8_t *)&_auStack_a8->name;
            uVar7 = *(uint8_t *)((long)&_auStack_a8->name + 1);
            _auStack_a8 = (st_ptls_aead_algorithm_t *)((long)&_auStack_a8->name + 2);
            uVar66 = *(ulong *)(__dest + 0x100);
            if (uVar66 < 0x10) {
              *(ulong *)(__dest + 0x100) = uVar66 + 1;
              __dest[uVar66 + 0xf0] = CONCAT11(uVar6,uVar7);
            }
            uVar68 = uVar68 - 2;
          } while (_auStack_a8 != psVar48);
          bVar135 = psVar48 == end;
          goto LAB_0010fb8c;
        }
      }
      goto LAB_0010efba;
    }
    if (uVar40 != 0) goto switchD_0010f2e6_caseD_2e;
    sStack_770 = 0x10f2c0;
    iVar44 = client_hello_decode_server_name(name,(uint8_t **)auStack_a8,(uint8_t *)end);
    puVar75 = local_768;
    if (iVar44 != 0) goto LAB_0010efba;
    bVar135 = _auStack_a8 == end;
LAB_0010fb8c:
    puVar75 = local_768;
    iVar44 = iVar45;
    if (!bVar135) goto LAB_0010efba;
  }
  _auStack_a8 = end;
  psVar48 = end;
  goto LAB_0010f162;
LAB_00110af7:
  if (*(st_ptls_key_exchange_context_t **)local_48 == (st_ptls_key_exchange_context_t *)0x0)
  goto LAB_001112d1;
  group = (*(st_ptls_key_exchange_context_t **)local_48)->algo->id;
  if (group == **(uint16_t **)issue_at) {
    iVar45 = build_esni_contents_hash
                       (local_1e0,local_e0->esni_contents_hash,(uint8_t *)local_108,group,
                        *(ptls_iovec_t *)(__dest + 0x58),puVar75);
    if (iVar45 == 0) {
      sStack_770 = 0x110b9b;
      iVar45 = (*(*(st_ptls_key_exchange_context_t **)local_48)->on_exchange)
                         ((st_ptls_key_exchange_context_t **)local_48,0,&(*esni)->secret,
                          *(ptls_iovec_t *)(__dest + 0x58));
      if (iVar45 == 0) {
        issue_at = *(uint64_t *)(__dest + 0x50);
        sVar54 = *(long *)(__dest + 0x68) - *(long *)(*(long *)(issue_at + 8) + 0x38);
        local_58 = (st_ptls_aead_algorithm_t *)0x0;
        tbs_start = 0;
        local_48 = (st_ptls_aead_algorithm_t *)0x0;
        local_70 = (st_ptls_aead_algorithm_t *)0x0;
        if (sVar54 != (ulong)(*local_60)->padded_length + 0x10) goto LAB_001112e9;
        sStack_770 = 0x111014;
        psVar48 = (st_ptls_aead_algorithm_t *)malloc(sVar54);
        if (psVar48 != (st_ptls_aead_algorithm_t *)0x0) {
          local_58 = (st_ptls_aead_algorithm_t *)0x0;
          sStack_770 = 0x111050;
          iVar44 = create_esni_aead((ptls_aead_context_t **)auStack_a8,0,
                                    (ptls_cipher_suite_t *)issue_at,(*esni)->secret,
                                    (*esni)->esni_contents_hash);
          psVar69 = _auStack_a8;
          local_48 = _auStack_a8;
          local_70 = psVar48;
          if (iVar44 != 0) {
            tbs_start = 0;
            goto LAB_001112e9;
          }
          local_58 = (st_ptls_aead_algorithm_t *)0x0;
          sVar130 = (*(_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
                       *)_auStack_a8->tag_size)
                              ((st_ptls_aead_context_t *)_auStack_a8,psVar48,
                               *(void **)(__dest + 100),*(size_t *)(__dest + 0x68),0,
                               *(void **)(__dest + 0x2c),*(size_t *)(__dest + 0x30));
          if (sVar130 != (ulong)(*local_60)->padded_length + 0x10) {
            tbs_start = 0;
            iVar44 = 0x33;
            goto LAB_001112e9;
          }
          sStack_770 = 0x1113dc;
          ptls_aead_free((ptls_aead_context_t *)psVar69);
          if ((ulong)(*local_60)->padded_length < 0x10) goto LAB_001113ed;
          auVar62 = (uint8_t  [8])((long)&psVar48->name + (ulong)(*local_60)->padded_length);
          ppVar28 = *esni;
          puVar75 = ((ptls_iovec_t *)&psVar48->confidentiality_limit)->base;
          *(st_ptls_aead_algorithm_t **)ppVar28->nonce = (st_ptls_aead_algorithm_t *)psVar48->name;
          *(uint8_t **)(ppVar28->nonce + 8) = puVar75;
          _local_100 = (uint8_t  [8])&psVar48->integrity_limit;
          sStack_770 = 0x11147e;
          iVar44 = client_hello_decode_server_name
                             ((ptls_iovec_t *)&stack0xfffffffffffffd98,
                              (uint8_t **)&stack0xffffffffffffff00,(uint8_t *)auVar62);
          sVar60.bits = _local_100;
          if (iVar44 != 0) goto LAB_00111485;
          goto LAB_001114a9;
        }
        iVar44 = 0x201;
        goto LAB_001112d1;
      }
    }
    local_58 = (st_ptls_aead_algorithm_t *)0x0;
    tbs_start = 0;
    local_48 = (st_ptls_aead_algorithm_t *)0x0;
    local_70 = (st_ptls_aead_algorithm_t *)0x0;
    iVar44 = iVar45;
    goto LAB_001112e9;
  }
  local_48 = (st_ptls_aead_algorithm_t *)((long)local_48 + 8);
  goto LAB_00110af7;
  while (uVar6 = *(uint8_t *)sVar60.bits, sVar60.bits = sVar60.bits + 1, uVar6 == '\0') {
LAB_001114a9:
    if (sVar60.bits == auVar62) {
      tbs_start = (size_t)cs;
      sStack_770 = 0x1114db;
      memmove(psVar48,psStack_268,(size_t)cs);
      local_48 = (st_ptls_aead_algorithm_t *)0x0;
      local_70 = (st_ptls_aead_algorithm_t *)0x0;
      iVar44 = 0;
      local_58 = psVar48;
      goto LAB_001112e9;
    }
  }
LAB_001113ed:
  iVar44 = 0x2f;
LAB_00111485:
  local_58 = (st_ptls_aead_algorithm_t *)0x0;
  tbs_start = 0;
  local_48 = (st_ptls_aead_algorithm_t *)0x0;
LAB_001112e9:
  sStack_770 = 0x1112f2;
  free(local_70);
  if (local_48 != (st_ptls_aead_algorithm_t *)0x0) {
    sStack_770 = 0x111302;
    ptls_aead_free((ptls_aead_context_t *)local_48);
  }
  if (iVar44 != 0) {
    puVar75 = local_768;
    if (*esni != (ptls_esni_secret_t *)0x0) {
      sStack_770 = 0x111321;
      free_esni_secret(esni,1);
      puVar75 = local_768;
    }
    goto LAB_0010efba;
  }
  ppVar63 = tls->ctx;
  psVar24 = ppVar63->update_esni_key;
  local_68._0_1_ = '\x01';
  if (psVar24 != (st_ptls_update_esni_key_t *)0x0) {
    sStack_770 = 0x111362;
    iVar44 = (*psVar24->cb)(psVar24,tls,tls->esni->secret,
                            *(ptls_hash_algorithm_t **)(*(long *)(__dest + 0x50) + 0x10),
                            tls->esni->esni_contents_hash);
    puVar75 = local_768;
    if (iVar44 != 0) goto LAB_0010efba;
    ppVar63 = tls->ctx;
  }
  bVar135 = false;
LAB_0010fe9b:
  if (ppVar63->on_client_hello == (ptls_on_client_hello_t *)0x0) {
    iVar44 = 0;
  }
  else {
    psStack_268 = local_58;
    cs = (ptls_cipher_suite_t *)tbs_start;
    local_248 = ppStack_b8;
    local_240 = *(_func_size_t_st_ptls_aead_context_t_ptr_void_ptr **)(__dest + 0xec);
    local_238 = local_d8;
    p_Stack_230 = *(_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
                    **)(__dest + 0x44);
    sStack_220 = *(size_t *)(__dest + 0x100);
    local_218 = __dest + 0x104;
    sStack_210 = *(size_t *)(__dest + 0x124);
    sStack_200 = *(size_t *)(__dest + 0x1ac);
    local_1f8 = (local_1f8 & 0xfc) + (char)local_68;
    sStack_770 = 0x10ff49;
    local_258 = msg;
    p_Stack_250 = msglen;
    local_228 = __dest + 0xf0;
    local_208 = __dest + 0x1a8;
    iVar44 = (*ppVar63->on_client_hello->cb)
                       (ppVar63->on_client_hello,tls,
                        (ptls_on_client_hello_parameters_t *)&stack0xfffffffffffffd98);
  }
  if (!bVar135) {
    sStack_770 = 0x10ff60;
    free(local_58);
  }
  puVar75 = local_768;
  if (iVar44 != 0) goto LAB_0010efba;
  uVar68 = *(ulong *)(__dest + 0x1ac);
  bVar64 = (byte)tls->ctx->field_0x70 >> 4 & 2;
  if ((uVar68 != 0) || (bVar64 != 0)) {
    sStack_770 = 0x2b;
    uVar66 = 0xffffffffffffffff;
    do {
      puVar75 = local_768;
      iVar44 = 0x2b;
      if (uVar66 - uVar68 == -1) goto LAB_0010efba;
      uVar2 = uVar66 + 1;
      lVar67 = uVar66 + 0x351;
      uVar66 = uVar2;
    } while (*(byte *)((long)__dest + lVar67) != bVar64);
    puVar75 = local_768;
    if (uVar68 <= uVar2) goto LAB_0010efba;
  }
  goto LAB_0010ff89;
LAB_0010fbad:
  if (psVar69 != psVar4) goto LAB_0010fbb2;
  sStack_770 = 0x10fbc9;
  iVar44 = is_supported_version(__dest[0x18]);
  if (iVar44 == 0) {
    if ((eVar9 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) &&
       (psVar13 = tls->ctx->on_client_hello, psVar13 != (st_ptls_on_client_hello_t *)0x0)) {
      psStack_268 = (st_ptls_aead_algorithm_t *)name->base;
      cs = *(ptls_cipher_suite_t **)(__dest + 0x4c);
      local_248 = ppStack_b8;
      local_240 = *(_func_size_t_st_ptls_aead_context_t_ptr_void_ptr **)(__dest + 0xec);
      local_238 = (st_ptls_signature_algorithms_t *)0x0;
      p_Stack_230 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
                     *)0x0;
      local_228 = (ushort *)0x0;
      sStack_220 = 0;
      local_218 = (ushort *)0x0;
      sStack_210 = 0;
      local_208 = (ushort *)0x0;
      sStack_200 = 0;
      local_1f8 = local_1f8 & 0xfc | 2;
      sStack_770 = 0x10fca0;
      local_258 = msg;
      p_Stack_250 = msglen;
      iVar44 = (*psVar13->cb)(psVar13,tls,
                              (ptls_on_client_hello_parameters_t *)&stack0xfffffffffffffd98);
      puVar75 = local_768;
      if (iVar44 != 0) goto LAB_0010efba;
    }
LAB_0010ef4a:
    psVar74 = &sStack_770;
    sStack_770 = 0x46;
  }
  else {
    if (*__dest < 0x301) goto LAB_0010ef4a;
    sStack_770 = 0x2f;
    iVar44 = 0x2f;
    puVar75 = local_768;
    if (((*(long *)(__dest + 0x14) != 1) ||
        (puVar75 = local_768, **(char **)(__dest + 0x10) != '\0')) ||
       ((psVar12 = *(short **)(__dest + 0x50), psVar12 != (short *)0x0 &&
        (puVar75 = local_768, *(long *)(__dest + 0x2c) == 0)))) goto LAB_0010efba;
    uVar40 = __dest[0x1a6];
    if (*(long *)(__dest + 0x14c) == 0) {
      puVar75 = local_768;
      if ((uVar40 & 1) != 0) goto LAB_0010efba;
    }
    else {
      puVar75 = local_768;
      if ((uVar40 & 2) == 0) goto LAB_0010efba;
    }
    ppVar63 = tls->ctx;
    if ((ppVar63->field_0x70 & 1) != 0) {
      *(byte *)(__dest + 0x1a4) = (byte)__dest[0x1a4] & 0xfe;
    }
    if (eVar9 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      puVar75 = *(uint8_t **)(__dest + 4);
      uVar32 = *(undefined8 *)puVar75;
      uVar34 = *(undefined8 *)(puVar75 + 8);
      uVar35 = *(undefined8 *)(puVar75 + 0x18);
      *(undefined8 *)(tls->client_random + 0x10) = *(undefined8 *)(puVar75 + 0x10);
      *(undefined8 *)(tls->client_random + 0x18) = uVar35;
      *(undefined8 *)tls->client_random = uVar32;
      *(undefined8 *)(tls->client_random + 8) = uVar34;
      if (*(long *)(__dest + 0xc) != 0) {
        tls->field_0x160 = tls->field_0x160 | 4;
      }
      if ((psVar12 != (short *)0x0) && (ppVar63->esni != (ptls_esni_context_t **)0x0)) {
        _auStack_a8 = (st_ptls_aead_algorithm_t *)0x0;
        if (tls->esni != (ptls_esni_secret_t *)0x0) {
          sStack_770 = 0x111516;
          __assert_fail("*secret == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                        ,0xbff,
                        "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                       );
        }
        esni = &tls->esni;
        sStack_770 = 0x10fdc4;
        local_e0 = (ptls_esni_secret_t *)calloc(1,0xd0);
        *esni = local_e0;
        if (local_e0 == (ptls_esni_secret_t *)0x0) {
          puVar75 = local_768;
          iVar44 = 0x201;
          goto LAB_0010efba;
        }
        iVar44 = 0x2f;
        for (local_60 = ppVar63->esni; ppVar15 = *local_60, ppVar15 != (ptls_esni_context_t *)0x0;
            local_60 = local_60 + 1) {
          puVar49 = ppVar15->cipher_suites[-1].record_digest;
          do {
            puVar1 = (undefined8 *)(puVar49 + 0x40);
            if ((short *)*puVar1 == (short *)0x0) goto LAB_001112d1;
            puVar49 = puVar49 + 0x48;
          } while (*(short *)*puVar1 != *psVar12);
          local_108 = *(ulong **)(__dest + 0x60);
          local_1e0 = *(ptls_hash_algorithm_t **)(psVar12 + 8);
          sStack_770 = 0x10fe52;
          iVar45 = bcmp(puVar49,local_108,local_1e0->digest_size);
          if (iVar45 == 0) {
            local_e0->version = ppVar15->version;
            local_48 = (st_ptls_aead_algorithm_t *)ppVar15->key_exchanges;
            goto LAB_00110af7;
          }
        }
LAB_001112d1:
        local_58 = (st_ptls_aead_algorithm_t *)0x0;
        tbs_start = 0;
        local_48 = (st_ptls_aead_algorithm_t *)0x0;
        local_70 = (st_ptls_aead_algorithm_t *)0x0;
        goto LAB_001112e9;
      }
      local_58 = (st_ptls_aead_algorithm_t *)name->base;
      bVar135 = true;
      if (local_58 == (st_ptls_aead_algorithm_t *)0x0) {
        local_58 = (st_ptls_aead_algorithm_t *)0x0;
        tbs_start = 0;
      }
      else {
        tbs_start = *(size_t *)(__dest + 0x4c);
      }
      local_68._0_1_ = '\0';
      goto LAB_0010fe9b;
    }
    if ((uVar40 & 1) != 0) goto LAB_0010fbb2;
    sStack_770 = 0x10fcf6;
    iVar44 = (*ptls_mem_equal)(tls->client_random,*(void **)(__dest + 4),0x20);
    puVar75 = local_768;
    if (iVar44 == 0) {
LAB_0010ffdc:
      psVar74 = (size_t *)(puVar75 + -8);
      puVar75[-8] = '(';
      puVar75[-7] = '\0';
      puVar75[-6] = '\0';
      puVar75[-5] = '\0';
      puVar75[-4] = '\0';
      puVar75[-3] = '\0';
      puVar75[-2] = '\0';
      puVar75[-1] = '\0';
    }
    else {
      pcVar14 = tls->server_name;
      if (pcVar14 != (char *)0x0) {
        sStack_770 = 0x10fd1a;
        sVar54 = strlen(pcVar14);
        puVar75 = local_768;
        if (*(size_t *)(__dest + 0x4c) == sVar54) {
          sStack_770 = 0x10fd39;
          iVar44 = bcmp(name->base,pcVar14,sVar54);
          puVar75 = local_768;
          if (iVar44 == 0) goto LAB_0010ff89;
        }
        goto LAB_0010ffdc;
      }
LAB_0010ff89:
      sStack_770 = 0x10ffb7;
      iVar44 = select_cipher((ptls_cipher_suite_t **)&stack0xfffffffffffffd98,
                             tls->ctx->cipher_suites,*(uint8_t **)(__dest + 0x1c),
                             *(uint8_t **)(__dest + 0x1c) + *(long *)(__dest + 0x20),
                             *(uint *)&tls->ctx->field_0x70 >> 6 & 1);
      puVar75 = local_768;
      if (iVar44 != 0) goto LAB_0010efba;
      if (eVar9 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
        puVar75 = local_768;
        if ((st_ptls_aead_algorithm_t *)tls->cipher_suite != psStack_268) goto LAB_0010ffdc;
      }
      else {
        tls->cipher_suite = (ptls_cipher_suite_t *)psStack_268;
        sStack_770 = 0x11004d;
        ppVar55 = key_schedule_new((ptls_cipher_suite_t *)psStack_268,(ptls_cipher_suite_t **)0x0,
                                   tls->ctx->hkdf_label_prefix__obsolete);
        tls->key_schedule = ppVar55;
      }
      if ((ppStack_188 != (ptls_key_exchange_algorithm_t *)0x0) ||
         (puVar58 = *(ushort **)(__dest + 0x2c), puVar58 == (ushort *)0x0)) {
LAB_0011005f:
        ppVar20 = ppStack_188;
        if (eVar9 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
          if (ppStack_188 != (ptls_key_exchange_algorithm_t *)0x0 && *(long *)(__dest + 300) != 0) {
            sVar130 = (*tls->ctx->cipher_suites)->hash->digest_size;
            lVar67 = -(sVar130 + 0xf & 0xfffffffffffffff0);
            puVar59 = local_768 + lVar67;
            pVar136 = *(ptls_iovec_t *)(__dest + 0x130);
            puVar76 = local_768 + lVar67 + -8;
            puVar76[0] = 0xfb;
            puVar76[1] = '\x03';
            puVar76[2] = '\x11';
            puVar76[3] = '\0';
            puVar76[4] = '\0';
            puVar76[5] = '\0';
            puVar76[6] = '\0';
            puVar76[7] = '\0';
            iVar44 = calc_cookie_signature(tls,properties,ppVar20,pVar136,puVar59);
            puVar75 = puVar59;
            if (iVar44 != 0) goto LAB_0010efba;
            if (*(size_t *)(__dest + 0x144) != sVar130) goto LAB_0010ffdc;
            pvVar25 = *(void **)(__dest + 0x140);
            puVar77 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"\'\x04\x11",4);
            puVar77[4] = '\0';
            puVar77[5] = '\0';
            puVar77[6] = '\0';
            puVar77[7] = '\0';
            iVar45 = (*ptls_mem_equal)(pvVar25,puVar59,sVar130);
            puVar78 = local_768 + lVar67 + -8;
            puVar78[0] = '(';
            puVar78[1] = '\0';
            puVar78[2] = '\0';
            puVar78[3] = '\0';
            puVar78[4] = '\0';
            puVar78[5] = '\0';
            puVar78[6] = '\0';
            puVar78[7] = '\0';
            iVar44 = (int)*(undefined8 *)(local_768 + lVar67 + -8);
            if (iVar45 == 0) goto LAB_0010efba;
            ppVar55 = tls->key_schedule;
            puVar79 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"@\x04\x11",4);
            puVar79[4] = '\0';
            puVar79[5] = '\0';
            puVar79[6] = '\0';
            puVar79[7] = '\0';
            key_schedule_update_ch1hash_prefix(ppVar55);
            ppVar55 = tls->key_schedule;
            puVar49 = *(uint8_t **)(__dest + 0x138);
            sVar130 = *(size_t *)(__dest + 0x13c);
            puVar80 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"W\x04\x11",4);
            puVar80[4] = '\0';
            puVar80[5] = '\0';
            puVar80[6] = '\0';
            puVar80[7] = '\0';
            ptls__key_schedule_update_hash(ppVar55,puVar49,sVar130);
            ppVar55 = tls->key_schedule;
            puVar81 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"d\x04\x11",4);
            puVar81[4] = '\0';
            puVar81[5] = '\0';
            puVar81[6] = '\0';
            puVar81[7] = '\0';
            key_schedule_extract(ppVar55,(ptls_iovec_t)ZEXT816(0));
            sVar130 = emitter->buf->off;
            p_Var21 = emitter->begin_message;
            puVar82 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"r\x04\x11",4);
            puVar82[4] = '\0';
            puVar82[5] = '\0';
            puVar82[6] = '\0';
            puVar82[7] = '\0';
            iVar44 = (*p_Var21)(emitter);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar134 = emitter->buf;
            ppVar55 = tls->key_schedule;
            sVar131 = ppVar134->off;
            local_c9 = 2;
            puVar83 = local_768 + lVar67 + -8;
            puVar83[0] = '\x01';
            puVar83[1] = '\0';
            puVar83[2] = '\0';
            puVar83[3] = '\0';
            puVar83[4] = '\0';
            puVar83[5] = '\0';
            puVar83[6] = '\0';
            puVar83[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar84 = local_768 + lVar67 + -8;
            puVar84[0] = 0xab;
            puVar84[1] = '\x04';
            puVar84[2] = '\x11';
            puVar84[3] = '\0';
            puVar84[4] = '\0';
            puVar84[5] = '\0';
            puVar84[6] = '\0';
            puVar84[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar134,&local_c9,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            puVar85 = local_768 + lVar67 + -8;
            puVar85[0] = '\x03';
            puVar85[1] = '\0';
            puVar85[2] = '\0';
            puVar85[3] = '\0';
            puVar85[4] = '\0';
            puVar85[5] = '\0';
            puVar85[6] = '\0';
            puVar85[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar86 = local_768 + lVar67 + -8;
            puVar86[0] = 0xc6;
            puVar86[1] = '\x04';
            puVar86[2] = '\x11';
            puVar86[3] = '\0';
            puVar86[4] = '\0';
            puVar86[5] = '\0';
            puVar86[6] = '\0';
            puVar86[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            local_60 = (ptls_esni_context_t **)ppVar134->off;
            ppVar127 = emitter->buf;
            local_14c = 0x303;
            puVar87 = local_768 + lVar67 + -8;
            puVar87[0] = '\x02';
            puVar87[1] = '\0';
            puVar87[2] = '\0';
            puVar87[3] = '\0';
            puVar87[4] = '\0';
            puVar87[5] = '\0';
            puVar87[6] = '\0';
            puVar87[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar88 = local_768 + lVar67 + -8;
            puVar88[0] = 0xf5;
            puVar88[1] = '\x04';
            puVar88[2] = '\x11';
            puVar88[3] = '\0';
            puVar88[4] = '\0';
            puVar88[5] = '\0';
            puVar88[6] = '\0';
            puVar88[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_14c,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            puVar89 = local_768 + lVar67 + -8;
            puVar89[0] = ' ';
            puVar89[1] = '\0';
            puVar89[2] = '\0';
            puVar89[3] = '\0';
            puVar89[4] = '\0';
            puVar89[5] = '\0';
            puVar89[6] = '\0';
            puVar89[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar90 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"\f\x05\x11",4);
            puVar90[4] = '\0';
            puVar90[5] = '\0';
            puVar90[6] = '\0';
            puVar90[7] = '\0';
            iVar44 = ptls_buffer_reserve(ppVar127,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            puVar49 = emitter->buf->base;
            sVar133 = emitter->buf->off;
            puVar52 = puVar49 + sVar133 + 0x10;
            puVar52[0] = 0xc2;
            puVar52[1] = 0xa2;
            puVar52[2] = '\x11';
            puVar52[3] = '\x16';
            puVar52[4] = 'z';
            puVar52[5] = 0xbb;
            puVar52[6] = 0x8c;
            puVar52[7] = '^';
            puVar52[8] = '\a';
            puVar52[9] = 0x9e;
            puVar52[10] = '\t';
            puVar52[0xb] = 0xe2;
            puVar52[0xc] = 200;
            puVar52[0xd] = 0xa8;
            puVar52[0xe] = '3';
            puVar52[0xf] = 0x9c;
            puVar49 = puVar49 + sVar133;
            puVar49[0] = 0xcf;
            puVar49[1] = '!';
            puVar49[2] = 0xad;
            puVar49[3] = 't';
            puVar49[4] = 0xe5;
            puVar49[5] = 0x9a;
            puVar49[6] = 'a';
            puVar49[7] = '\x11';
            puVar49[8] = 0xbe;
            puVar49[9] = '\x1d';
            puVar49[10] = 0x8c;
            puVar49[0xb] = '\x02';
            puVar49[0xc] = '\x1e';
            puVar49[0xd] = 'e';
            puVar49[0xe] = 0xb8;
            puVar49[0xf] = 0x91;
            ppVar127 = emitter->buf;
            psVar3 = &ppVar127->off;
            *psVar3 = *psVar3 + 0x20;
            puVar91 = local_768 + lVar67 + -8;
            puVar91[0] = '\x01';
            puVar91[1] = '\0';
            puVar91[2] = '\0';
            puVar91[3] = '\0';
            puVar91[4] = '\0';
            puVar91[5] = '\0';
            puVar91[6] = '\0';
            puVar91[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar92 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"P\x05\x11",4);
            puVar92[4] = '\0';
            puVar92[5] = '\0';
            puVar92[6] = '\0';
            puVar92[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            sVar133 = ppVar127->off;
            pvVar25 = *(void **)(__dest + 8);
            sVar73 = *(size_t *)(__dest + 0xc);
            puVar93 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"t\x05\x11",4);
            puVar93[4] = '\0';
            puVar93[5] = '\0';
            puVar93[6] = '\0';
            puVar93[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,pvVar25,sVar73);
            if (iVar44 != 0) goto LAB_0010efba;
            emitter->buf->base[sVar133 - 1] = (char)(int)emitter->buf->off - (char)sVar133;
            uVar40 = tls->cipher_suite->id;
            ppVar127 = emitter->buf;
            local_14a = uVar40 << 8 | uVar40 >> 8;
            puVar94 = local_768 + lVar67 + -8;
            puVar94[0] = '\x02';
            puVar94[1] = '\0';
            puVar94[2] = '\0';
            puVar94[3] = '\0';
            puVar94[4] = '\0';
            puVar94[5] = '\0';
            puVar94[6] = '\0';
            puVar94[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar95 = local_768 + lVar67 + -8;
            puVar95[0] = 0xba;
            puVar95[1] = '\x05';
            puVar95[2] = '\x11';
            puVar95[3] = '\0';
            puVar95[4] = '\0';
            puVar95[5] = '\0';
            puVar95[6] = '\0';
            puVar95[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_14a,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            local_c8 = 0;
            puVar96 = local_768 + lVar67 + -8;
            puVar96[0] = '\x01';
            puVar96[1] = '\0';
            puVar96[2] = '\0';
            puVar96[3] = '\0';
            puVar96[4] = '\0';
            puVar96[5] = '\0';
            puVar96[6] = '\0';
            puVar96[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar97 = local_768 + lVar67 + -8;
            puVar97[0] = 0xdb;
            puVar97[1] = '\x05';
            puVar97[2] = '\x11';
            puVar97[3] = '\0';
            puVar97[4] = '\0';
            puVar97[5] = '\0';
            puVar97[6] = '\0';
            puVar97[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_c8,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            puVar98 = local_768 + lVar67 + -8;
            puVar98[0] = '\x02';
            puVar98[1] = '\0';
            puVar98[2] = '\0';
            puVar98[3] = '\0';
            puVar98[4] = '\0';
            puVar98[5] = '\0';
            puVar98[6] = '\0';
            puVar98[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar99 = local_768 + lVar67 + -8;
            puVar99[0] = 0xf9;
            puVar99[1] = '\x05';
            puVar99[2] = '\x11';
            puVar99[3] = '\0';
            puVar99[4] = '\0';
            puVar99[5] = '\0';
            puVar99[6] = '\0';
            puVar99[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            ppStack_b8 = (ptls_iovec_t *)ppVar127->off;
            local_148 = 0x2b00;
            puVar100 = local_768 + lVar67 + -8;
            puVar100[0] = '\x02';
            puVar100[1] = '\0';
            puVar100[2] = '\0';
            puVar100[3] = '\0';
            puVar100[4] = '\0';
            puVar100[5] = '\0';
            puVar100[6] = '\0';
            puVar100[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar101 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"\'\x06\x11",4);
            puVar101[4] = '\0';
            puVar101[5] = '\0';
            puVar101[6] = '\0';
            puVar101[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_148,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            puVar102 = local_768 + lVar67 + -8;
            puVar102[0] = '\x02';
            puVar102[1] = '\0';
            puVar102[2] = '\0';
            puVar102[3] = '\0';
            puVar102[4] = '\0';
            puVar102[5] = '\0';
            puVar102[6] = '\0';
            puVar102[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar103 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"E\x06\x11",4);
            puVar103[4] = '\0';
            puVar103[5] = '\0';
            puVar103[6] = '\0';
            puVar103[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            local_70 = (st_ptls_aead_algorithm_t *)ppVar127->off;
            local_146 = __dest[0x18] << 8 | __dest[0x18] >> 8;
            puVar104 = local_768 + lVar67 + -8;
            puVar104[0] = '\x02';
            puVar104[1] = '\0';
            puVar104[2] = '\0';
            puVar104[3] = '\0';
            puVar104[4] = '\0';
            puVar104[5] = '\0';
            puVar104[6] = '\0';
            puVar104[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar105 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"v\x06\x11",4);
            puVar105[4] = '\0';
            puVar105[5] = '\0';
            puVar105[6] = '\0';
            puVar105[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_146,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            uVar68 = emitter->buf->off - (long)local_70;
            puVar106 = local_768 + lVar67 + -8;
            puVar106[0] = '\b';
            puVar106[1] = '\0';
            puVar106[2] = '\0';
            puVar106[3] = '\0';
            puVar106[4] = '\0';
            puVar106[5] = '\0';
            puVar106[6] = '\0';
            puVar106[7] = '\0';
            for (lVar132 = *(long *)(local_768 + lVar67 + -8); lVar132 != -8; lVar132 = lVar132 + -8
                ) {
              emitter->buf->base[(long)local_70 - 2] = (uint8_t)(uVar68 >> ((byte)lVar132 & 0x3f));
              local_70 = (st_ptls_aead_algorithm_t *)((long)local_70 + 1);
            }
            ppVar127 = emitter->buf;
            if ((__dest[0x148] & 1) != 0) {
              local_144 = 0x3300;
              puVar108 = local_768 + lVar67 + -8;
              puVar108[0] = '\x02';
              puVar108[1] = '\0';
              puVar108[2] = '\0';
              puVar108[3] = '\0';
              puVar108[4] = '\0';
              puVar108[5] = '\0';
              puVar108[6] = '\0';
              puVar108[7] = '\0';
              sVar133 = *(size_t *)(local_768 + lVar67 + -8);
              puVar109 = local_768 + lVar67 + -8;
              builtin_memcpy(local_768 + lVar67 + -8,"h\x17\x11",4);
              puVar109[4] = '\0';
              puVar109[5] = '\0';
              puVar109[6] = '\0';
              puVar109[7] = '\0';
              iVar44 = ptls_buffer__do_pushv(ppVar127,&local_144,sVar133);
              if (iVar44 != 0) goto LAB_0010efba;
              ppVar127 = emitter->buf;
              puVar110 = local_768 + lVar67 + -8;
              puVar110[0] = '\x02';
              puVar110[1] = '\0';
              puVar110[2] = '\0';
              puVar110[3] = '\0';
              puVar110[4] = '\0';
              puVar110[5] = '\0';
              puVar110[6] = '\0';
              puVar110[7] = '\0';
              sVar133 = *(size_t *)(local_768 + lVar67 + -8);
              puVar111 = local_768 + lVar67 + -8;
              puVar111[0] = 0x86;
              puVar111[1] = '\x17';
              puVar111[2] = '\x11';
              puVar111[3] = '\0';
              puVar111[4] = '\0';
              puVar111[5] = '\0';
              puVar111[6] = '\0';
              puVar111[7] = '\0';
              iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
              if (iVar44 != 0) goto LAB_0010efba;
              ppVar127 = emitter->buf;
              local_70 = (st_ptls_aead_algorithm_t *)ppVar127->off;
              local_142 = ppVar20->id << 8 | ppVar20->id >> 8;
              puVar112 = local_768 + lVar67 + -8;
              puVar112[0] = '\x02';
              puVar112[1] = '\0';
              puVar112[2] = '\0';
              puVar112[3] = '\0';
              puVar112[4] = '\0';
              puVar112[5] = '\0';
              puVar112[6] = '\0';
              puVar112[7] = '\0';
              sVar133 = *(size_t *)(local_768 + lVar67 + -8);
              puVar113 = local_768 + lVar67 + -8;
              puVar113[0] = 0xba;
              puVar113[1] = '\x17';
              puVar113[2] = '\x11';
              puVar113[3] = '\0';
              puVar113[4] = '\0';
              puVar113[5] = '\0';
              puVar113[6] = '\0';
              puVar113[7] = '\0';
              iVar44 = ptls_buffer__do_pushv(ppVar127,&local_142,sVar133);
              if (iVar44 != 0) goto LAB_0010efba;
              uVar68 = emitter->buf->off - (long)local_70;
              puVar114 = local_768 + lVar67 + -8;
              puVar114[0] = '\b';
              puVar114[1] = '\0';
              puVar114[2] = '\0';
              puVar114[3] = '\0';
              puVar114[4] = '\0';
              puVar114[5] = '\0';
              puVar114[6] = '\0';
              puVar114[7] = '\0';
              for (lVar132 = *(long *)(local_768 + lVar67 + -8); lVar132 != -8;
                  lVar132 = lVar132 + -8) {
                emitter->buf->base[(long)local_70 - 2] = (uint8_t)(uVar68 >> ((byte)lVar132 & 0x3f))
                ;
                local_70 = (st_ptls_aead_algorithm_t *)((long)local_70 + 1);
              }
              ppVar127 = emitter->buf;
            }
            local_140 = 0x2c00;
            puVar115 = local_768 + lVar67 + -8;
            puVar115[0] = '\x02';
            puVar115[1] = '\0';
            puVar115[2] = '\0';
            puVar115[3] = '\0';
            puVar115[4] = '\0';
            puVar115[5] = '\0';
            puVar115[6] = '\0';
            puVar115[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar116 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"\x02\x1a\x11",4);
            puVar116[4] = '\0';
            puVar116[5] = '\0';
            puVar116[6] = '\0';
            puVar116[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_140,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            puVar117 = local_768 + lVar67 + -8;
            puVar117[0] = '\x02';
            puVar117[1] = '\0';
            puVar117[2] = '\0';
            puVar117[3] = '\0';
            puVar117[4] = '\0';
            puVar117[5] = '\0';
            puVar117[6] = '\0';
            puVar117[7] = '\0';
            sVar133 = *(size_t *)(local_768 + lVar67 + -8);
            puVar118 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8," \x1a\x11",4);
            puVar118[4] = '\0';
            puVar118[5] = '\0';
            puVar118[6] = '\0';
            puVar118[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar127 = emitter->buf;
            local_48 = (st_ptls_aead_algorithm_t *)ppVar127->off;
            pvVar25 = *(void **)(__dest + 0x128);
            sVar133 = *(size_t *)(__dest + 300);
            puVar119 = local_768 + lVar67 + -8;
            builtin_memcpy(local_768 + lVar67 + -8,"J\x1a\x11",4);
            puVar119[4] = '\0';
            puVar119[5] = '\0';
            puVar119[6] = '\0';
            puVar119[7] = '\0';
            iVar44 = ptls_buffer__do_pushv(ppVar127,pvVar25,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            uVar68 = emitter->buf->off - (long)local_48;
            puVar120 = local_768 + lVar67 + -8;
            puVar120[0] = '\b';
            puVar120[1] = '\0';
            puVar120[2] = '\0';
            puVar120[3] = '\0';
            puVar120[4] = '\0';
            puVar120[5] = '\0';
            puVar120[6] = '\0';
            puVar120[7] = '\0';
            for (lVar132 = *(long *)(local_768 + lVar67 + -8); lVar132 != -8; lVar132 = lVar132 + -8
                ) {
              emitter->buf->base[(long)local_48 - 2] = (uint8_t)(uVar68 >> ((byte)lVar132 & 0x3f));
              local_48 = (st_ptls_aead_algorithm_t *)((long)local_48 + 1);
            }
            uVar68 = emitter->buf->off - (long)ppStack_b8;
            puVar121 = local_768 + lVar67 + -8;
            puVar121[0] = '\b';
            puVar121[1] = '\0';
            puVar121[2] = '\0';
            puVar121[3] = '\0';
            puVar121[4] = '\0';
            puVar121[5] = '\0';
            puVar121[6] = '\0';
            puVar121[7] = '\0';
            for (lVar132 = *(long *)(local_768 + lVar67 + -8); lVar132 != -8; lVar132 = lVar132 + -8
                ) {
              (emitter->buf->base + -2)[(long)ppStack_b8] =
                   (uint8_t)(uVar68 >> ((byte)lVar132 & 0x3f));
              ppStack_b8 = (ptls_iovec_t *)((long)&ppStack_b8->base + 1);
            }
            uVar68 = ppVar134->off - (long)local_60;
            puVar122 = local_768 + lVar67 + -8;
            puVar122[0] = '\x10';
            puVar122[1] = '\0';
            puVar122[2] = '\0';
            puVar122[3] = '\0';
            puVar122[4] = '\0';
            puVar122[5] = '\0';
            puVar122[6] = '\0';
            puVar122[7] = '\0';
            for (lVar132 = *(long *)(local_768 + lVar67 + -8); lVar132 != -8; lVar132 = lVar132 + -8
                ) {
              ppVar134->base[(long)local_60 - 3] = (uint8_t)(uVar68 >> ((byte)lVar132 & 0x3f));
              local_60 = (ptls_esni_context_t **)((long)local_60 + 1);
            }
            if (ppVar55 != (ptls_key_schedule_t *)0x0) {
              puVar49 = ppVar134->base;
              sVar133 = ppVar134->off;
              puVar123 = local_768 + lVar67 + -8;
              puVar123[0] = 0xf5;
              puVar123[1] = '!';
              puVar123[2] = '\x11';
              puVar123[3] = '\0';
              puVar123[4] = '\0';
              puVar123[5] = '\0';
              puVar123[6] = '\0';
              puVar123[7] = '\0';
              ptls__key_schedule_update_hash(ppVar55,puVar49 + sVar131,sVar133 - sVar131);
            }
            p_Var21 = emitter->commit_message;
            puVar124 = local_768 + lVar67 + -8;
            puVar124[0] = 0xfc;
            puVar124[1] = '!';
            puVar124[2] = '\x11';
            puVar124[3] = '\0';
            puVar124[4] = '\0';
            puVar124[5] = '\0';
            puVar124[6] = '\0';
            puVar124[7] = '\0';
            iVar44 = (*p_Var21)(emitter);
            if (iVar44 != 0) goto LAB_0010efba;
            emitter->buf->off = sVar130;
            goto LAB_00110069;
          }
          if (ppStack_188 != (ptls_key_exchange_algorithm_t *)0x0) {
            puVar75 = local_768;
            bVar135 = true;
            if ((properties != (ptls_handshake_properties_t *)0x0) &&
               (puVar75 = local_768, bVar135 = true,
               (*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0)) goto LAB_001107a5;
            goto LAB_00110070;
          }
LAB_001107a5:
          puVar58 = *(ushort **)(__dest + 0x24);
          if (puVar58 == (ushort *)0x0) {
            psVar74 = &sStack_770;
            sStack_770 = 0x6d;
            goto LAB_0010ef4c;
          }
          uVar68 = *(ulong *)(__dest + 0x28);
          sStack_770 = 0x32;
          iVar44 = 0x32;
          puVar75 = local_768;
          if ((uVar68 < 2) ||
             (uVar66 = (ulong)(ushort)(*puVar58 << 8 | *puVar58 >> 8), puVar75 = local_768,
             uVar68 - 2 < uVar66)) goto LAB_0010efba;
          local_58 = (st_ptls_aead_algorithm_t *)0x8;
          sStack_770 = 0x10;
          tbs_start = 0x10;
          lVar67 = uVar68 + (long)puVar58;
          puVar126 = (ushort *)((long)puVar58 + uVar66 + 2);
          while (puVar58 = puVar58 + 1, puVar58 != puVar126) {
            puVar75 = local_768;
            if ((long)puVar126 - (long)puVar58 < 2) goto LAB_0010efba;
            pppVar57 = tls->ctx->key_exchanges;
            while (negotiated_group = *pppVar57,
                  negotiated_group != (ptls_key_exchange_algorithm_t *)0x0) {
              pppVar57 = pppVar57 + 1;
              if (negotiated_group->id == (uint16_t)(*puVar58 << 8 | *puVar58 >> 8)) {
                sStack_770 = 0x110851;
                ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)msg,(size_t)msglen);
                if (tls->key_schedule->generation != 0) {
                  sStack_770 = 0x1118e0;
                  __assert_fail("tls->key_schedule->generation == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                ,0xf33,
                                "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                               );
                }
                if ((properties == (ptls_handshake_properties_t *)0x0) ||
                   ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
                  sStack_770 = 0x110878;
                  key_schedule_transform_post_ch1hash(tls->key_schedule);
                  sStack_770 = 0x110889;
                  key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                  sStack_770 = 0x110890;
                  iVar44 = (*emitter->begin_message)(emitter);
                  puVar75 = local_768;
                  if (iVar44 == 0) {
                    ppVar134 = emitter->buf;
                    ppVar55 = tls->key_schedule;
                    sVar130 = ppVar134->off;
                    local_c4 = 2;
                    sStack_770 = 0x1108c5;
                    iVar44 = ptls_buffer__do_pushv(ppVar134,&local_c4,1);
                    puVar75 = local_768;
                    if (iVar44 == 0) {
                      sStack_770 = 0x1108df;
                      iVar44 = ptls_buffer__do_pushv(ppVar134,"",3);
                      puVar75 = local_768;
                      if (iVar44 == 0) {
                        local_58 = (st_ptls_aead_algorithm_t *)ppVar134->off;
                        local_130 = 0x303;
                        sStack_770 = 0x11090b;
                        iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_130,2);
                        puVar75 = local_768;
                        if (iVar44 == 0) {
                          sStack_770 = 0x110922;
                          iVar44 = ptls_buffer_reserve(emitter->buf,0x20);
                          puVar75 = local_768;
                          if (iVar44 == 0) {
                            puVar75 = emitter->buf->base;
                            sVar131 = emitter->buf->off;
                            puVar59 = puVar75 + sVar131 + 0x10;
                            puVar59[0] = 0xc2;
                            puVar59[1] = 0xa2;
                            puVar59[2] = '\x11';
                            puVar59[3] = '\x16';
                            puVar59[4] = 'z';
                            puVar59[5] = 0xbb;
                            puVar59[6] = 0x8c;
                            puVar59[7] = '^';
                            puVar59[8] = '\a';
                            puVar59[9] = 0x9e;
                            puVar59[10] = '\t';
                            puVar59[0xb] = 0xe2;
                            puVar59[0xc] = 200;
                            puVar59[0xd] = 0xa8;
                            puVar59[0xe] = '3';
                            puVar59[0xf] = 0x9c;
                            puVar75 = puVar75 + sVar131;
                            puVar75[0] = 0xcf;
                            puVar75[1] = '!';
                            puVar75[2] = 0xad;
                            puVar75[3] = 't';
                            puVar75[4] = 0xe5;
                            puVar75[5] = 0x9a;
                            puVar75[6] = 'a';
                            puVar75[7] = '\x11';
                            puVar75[8] = 0xbe;
                            puVar75[9] = '\x1d';
                            puVar75[10] = 0x8c;
                            puVar75[0xb] = '\x02';
                            puVar75[0xc] = '\x1e';
                            puVar75[0xd] = 'e';
                            puVar75[0xe] = 0xb8;
                            puVar75[0xf] = 0x91;
                            ppVar127 = emitter->buf;
                            psVar3 = &ppVar127->off;
                            *psVar3 = *psVar3 + 0x20;
                            sStack_770 = 0x110966;
                            iVar44 = ptls_buffer__do_pushv(ppVar127,"",1);
                            puVar75 = local_768;
                            if (iVar44 == 0) {
                              sVar131 = emitter->buf->off;
                              sStack_770 = 0x11098a;
                              iVar44 = ptls_buffer__do_pushv
                                                 (emitter->buf,*(void **)(__dest + 8),
                                                  *(size_t *)(__dest + 0xc));
                              puVar75 = local_768;
                              if (iVar44 == 0) {
                                emitter->buf->base[sVar131 - 1] =
                                     (char)(int)emitter->buf->off - (char)sVar131;
                                uVar40 = tls->cipher_suite->id;
                                local_12e = uVar40 << 8 | uVar40 >> 8;
                                sStack_770 = 0x1109d0;
                                iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_12e,2);
                                puVar75 = local_768;
                                if (iVar44 == 0) {
                                  local_c3 = 0;
                                  sStack_770 = 0x1109f1;
                                  iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_c3,1);
                                  puVar75 = local_768;
                                  if (iVar44 == 0) {
                                    sStack_770 = 0x110a0f;
                                    iVar44 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                    puVar75 = local_768;
                                    if (iVar44 == 0) {
                                      local_68 = emitter->buf->off;
                                      local_12c = 0x2b00;
                                      sStack_770 = 0x110a3a;
                                      iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_12c,2);
                                      puVar75 = local_768;
                                      if (iVar44 == 0) {
                                        sStack_770 = 0x110a58;
                                        iVar44 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                        puVar75 = local_768;
                                        if (iVar44 == 0) {
                                          tbs_start = emitter->buf->off;
                                          local_12a = __dest[0x18] << 8 | __dest[0x18] >> 8;
                                          sStack_770 = 0x110a89;
                                          iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_12a,2);
                                          puVar75 = local_768;
                                          if (iVar44 == 0) {
                                            uVar68 = emitter->buf->off - tbs_start;
                                            for (lVar67 = 8; lVar67 != -8; lVar67 = lVar67 + -8) {
                                              emitter->buf->base[tbs_start - 2] =
                                                   (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
                                              tbs_start = tbs_start + 1;
                                            }
                                            ppVar127 = emitter->buf;
                                            if (ppVar20 == (ptls_key_exchange_algorithm_t *)0x0) {
                                              local_128 = 0x3300;
                                              sStack_770 = 0x111829;
                                              iVar44 = ptls_buffer__do_pushv(ppVar127,&local_128,2);
                                              puVar75 = local_768;
                                              if (iVar44 != 0) goto LAB_0010efba;
                                              sStack_770 = 0x111847;
                                              iVar44 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                              puVar75 = local_768;
                                              if (iVar44 != 0) goto LAB_0010efba;
                                              local_48 = (st_ptls_aead_algorithm_t *)
                                                         emitter->buf->off;
                                              local_126 = negotiated_group->id << 8 |
                                                          negotiated_group->id >> 8;
                                              sStack_770 = 0x111878;
                                              iVar44 = ptls_buffer__do_pushv
                                                                 (emitter->buf,&local_126,2);
                                              puVar75 = local_768;
                                              if (iVar44 != 0) goto LAB_0010efba;
                                              uVar68 = emitter->buf->off - (long)local_48;
                                              for (lVar67 = 8; lVar67 != -8; lVar67 = lVar67 + -8) {
                                                emitter->buf->base[(long)local_48 - 2] =
                                                     (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
                                                local_48 = (st_ptls_aead_algorithm_t *)
                                                           ((long)local_48 + 1);
                                              }
                                              ppVar127 = emitter->buf;
                                            }
                                            uVar68 = ppVar127->off - local_68;
                                            for (lVar67 = 8; lVar67 != -8; lVar67 = lVar67 + -8) {
                                              emitter->buf->base[local_68 - 2] =
                                                   (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
                                              local_68 = local_68 + 1;
                                            }
                                            uVar68 = ppVar134->off - (long)local_58;
                                            for (lVar67 = 0x10; lVar67 != -8; lVar67 = lVar67 + -8)
                                            {
                                              ppVar134->base[(long)local_58 - 3] =
                                                   (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
                                              local_58 = (st_ptls_aead_algorithm_t *)
                                                         ((long)local_58 + 1);
                                            }
                                            if (ppVar55 != (ptls_key_schedule_t *)0x0) {
                                              sStack_770 = 0x1120ec;
                                              ptls__key_schedule_update_hash
                                                        (ppVar55,ppVar134->base + sVar130,
                                                         ppVar134->off - sVar130);
                                            }
                                            sStack_770 = 0x1120f3;
                                            iVar44 = (*emitter->commit_message)(emitter);
                                            puVar75 = local_768;
                                            if (iVar44 == 0) {
                                              sStack_770 = 0x112108;
                                              iVar44 = push_change_cipher_spec(tls,emitter);
                                              puVar75 = local_768;
                                              if (iVar44 == 0) {
                                                tls->state = 
                                                PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                                puVar75 = local_768;
                                                iVar44 = 0x202;
                                                if ((__dest[0x1a6] & 1) != 0) {
                                                  (tls->field_18).server.early_data_skipped_bytes =
                                                       0;
                                                  puVar75 = local_768;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0010efba;
                }
                sStack_770 = 0x11107e;
                iVar44 = (*emitter->begin_message)(emitter);
                puVar75 = local_768;
                if (iVar44 == 0) {
                  ppVar134 = emitter->buf;
                  local_c7 = 2;
                  sStack_770 = 0x1110a2;
                  iVar44 = ptls_buffer__do_pushv(ppVar134,&local_c7,1);
                  puVar75 = local_768;
                  if (iVar44 == 0) {
                    sStack_770 = 0x1110bc;
                    iVar44 = ptls_buffer__do_pushv(ppVar134,"",3);
                    puVar75 = local_768;
                    if (iVar44 == 0) {
                      local_68 = ppVar134->off;
                      local_13e = 0x303;
                      sStack_770 = 0x1110e7;
                      iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_13e,2);
                      puVar75 = local_768;
                      if (iVar44 == 0) {
                        sStack_770 = 0x1110fe;
                        iVar44 = ptls_buffer_reserve(emitter->buf,0x20);
                        puVar75 = local_768;
                        if (iVar44 == 0) {
                          puVar75 = emitter->buf->base;
                          sVar130 = emitter->buf->off;
                          puVar59 = puVar75 + sVar130 + 0x10;
                          puVar59[0] = 0xc2;
                          puVar59[1] = 0xa2;
                          puVar59[2] = '\x11';
                          puVar59[3] = '\x16';
                          puVar59[4] = 'z';
                          puVar59[5] = 0xbb;
                          puVar59[6] = 0x8c;
                          puVar59[7] = '^';
                          puVar59[8] = '\a';
                          puVar59[9] = 0x9e;
                          puVar59[10] = '\t';
                          puVar59[0xb] = 0xe2;
                          puVar59[0xc] = 200;
                          puVar59[0xd] = 0xa8;
                          puVar59[0xe] = '3';
                          puVar59[0xf] = 0x9c;
                          puVar75 = puVar75 + sVar130;
                          puVar75[0] = 0xcf;
                          puVar75[1] = '!';
                          puVar75[2] = 0xad;
                          puVar75[3] = 't';
                          puVar75[4] = 0xe5;
                          puVar75[5] = 0x9a;
                          puVar75[6] = 'a';
                          puVar75[7] = '\x11';
                          puVar75[8] = 0xbe;
                          puVar75[9] = '\x1d';
                          puVar75[10] = 0x8c;
                          puVar75[0xb] = '\x02';
                          puVar75[0xc] = '\x1e';
                          puVar75[0xd] = 'e';
                          puVar75[0xe] = 0xb8;
                          puVar75[0xf] = 0x91;
                          ppVar127 = emitter->buf;
                          psVar3 = &ppVar127->off;
                          *psVar3 = *psVar3 + 0x20;
                          sStack_770 = 0x111142;
                          iVar44 = ptls_buffer__do_pushv(ppVar127,"",1);
                          puVar75 = local_768;
                          if (iVar44 == 0) {
                            sVar130 = emitter->buf->off;
                            sStack_770 = 0x111162;
                            iVar44 = ptls_buffer__do_pushv
                                               (emitter->buf,*(void **)(__dest + 8),
                                                *(size_t *)(__dest + 0xc));
                            puVar75 = local_768;
                            if (iVar44 == 0) {
                              emitter->buf->base[sVar130 - 1] =
                                   (char)(int)emitter->buf->off - (char)sVar130;
                              uVar40 = tls->cipher_suite->id;
                              local_13c = uVar40 << 8 | uVar40 >> 8;
                              sStack_770 = 0x1111a6;
                              iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_13c,2);
                              puVar75 = local_768;
                              if (iVar44 == 0) {
                                local_c6 = 0;
                                sStack_770 = 0x1111c7;
                                iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_c6,1);
                                puVar75 = local_768;
                                if (iVar44 == 0) {
                                  sStack_770 = 0x1111e5;
                                  iVar44 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                  puVar75 = local_768;
                                  if (iVar44 == 0) {
                                    local_60 = (ptls_esni_context_t **)emitter->buf->off;
                                    local_13a = 0x2b00;
                                    sStack_770 = 0x111210;
                                    iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_13a,2);
                                    puVar75 = local_768;
                                    if (iVar44 == 0) {
                                      sStack_770 = 0x11122e;
                                      iVar44 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                      puVar75 = local_768;
                                      if (iVar44 == 0) {
                                        sVar130 = emitter->buf->off;
                                        local_138 = __dest[0x18] << 8 | __dest[0x18] >> 8;
                                        sStack_770 = 0x11125b;
                                        iVar44 = ptls_buffer__do_pushv(emitter->buf,&local_138,2);
                                        puVar75 = local_768;
                                        if (iVar44 == 0) {
                                          uVar68 = emitter->buf->off - sVar130;
                                          for (; local_58 !=
                                                 (st_ptls_aead_algorithm_t *)0xfffffffffffffff8;
                                              local_58 = (st_ptls_aead_algorithm_t *)
                                                         ((long)local_58 + -8)) {
                                            emitter->buf->base[sVar130 - 2] =
                                                 (uint8_t)(uVar68 >> ((byte)local_58 & 0x3f));
                                            sVar130 = sVar130 + 1;
                                          }
                                          ppVar127 = emitter->buf;
                                          if (ppVar20 == (ptls_key_exchange_algorithm_t *)0x0) {
                                            local_136 = 0x3300;
                                            sStack_770 = 0x111928;
                                            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_136,2);
                                            puVar75 = local_768;
                                            if (iVar44 != 0) goto LAB_0010efba;
                                            sStack_770 = 0x111946;
                                            iVar44 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                            puVar75 = local_768;
                                            if (iVar44 != 0) goto LAB_0010efba;
                                            sVar130 = emitter->buf->off;
                                            local_134 = negotiated_group->id << 8 |
                                                        negotiated_group->id >> 8;
                                            sStack_770 = 0x111973;
                                            iVar44 = ptls_buffer__do_pushv
                                                               (emitter->buf,&local_134,2);
                                            puVar75 = local_768;
                                            if (iVar44 != 0) goto LAB_0010efba;
                                            uVar68 = emitter->buf->off - sVar130;
                                            for (lVar67 = 8; lVar67 != -8; lVar67 = lVar67 + -8) {
                                              emitter->buf->base[sVar130 - 2] =
                                                   (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
                                              sVar130 = sVar130 + 1;
                                            }
                                            ppVar127 = emitter->buf;
                                          }
                                          local_132 = 0x2c00;
                                          sStack_770 = 0x111af2;
                                          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_132,2);
                                          puVar75 = local_768;
                                          if (iVar44 == 0) {
                                            sStack_770 = 0x111b0c;
                                            iVar44 = ptls_buffer__do_pushv(ppVar127,"",2);
                                            puVar75 = local_768;
                                            if (iVar44 == 0) {
                                              sVar130 = ppVar127->off;
                                              sStack_770 = 0x111b2f;
                                              iVar44 = ptls_buffer__do_pushv(ppVar127,"",2);
                                              puVar75 = local_768;
                                              if (iVar44 == 0) {
                                                sVar131 = ppVar127->off;
                                                sStack_770 = 0x111b52;
                                                iVar44 = ptls_buffer__do_pushv(ppVar127,"",2);
                                                puVar75 = local_768;
                                                if (iVar44 == 0) {
                                                  session_id._24_8_ = ppVar127->off;
                                                  sStack_770 = 0x111b75;
                                                  iVar44 = ptls_buffer__do_pushv(ppVar127,"",1);
                                                  puVar75 = local_768;
                                                  if (iVar44 == 0) {
                                                    sVar133 = ppVar127->off;
                                                    local_d8 = (st_ptls_signature_algorithms_t *)
                                                               tls->cipher_suite->hash->digest_size;
                                                    sStack_770 = 0x111ba8;
                                                    iVar44 = ptls_buffer_reserve(ppVar127,(size_t)
                                                  local_d8);
                                                  puVar75 = local_768;
                                                  if (iVar44 == 0) {
                                                    psVar61 = tls->key_schedule->hashes[0].ctx;
                                                    sStack_770 = 0x111bcb;
                                                    (*psVar61->final)(psVar61,ppVar127->base +
                                                                              ppVar127->off,
                                                                      PTLS_HASH_FINAL_MODE_RESET);
                                                    sVar73 = (long)local_d8->list + ppVar127->off;
                                                    local_c5 = ppVar20 ==
                                                               (ptls_key_exchange_algorithm_t *)0x0;
                                                    ppVar127->off = sVar73;
                                                    ppVar127->base[sVar133 - 1] =
                                                         (char)sVar73 - (char)sVar133;
                                                    sStack_770 = 0x111c06;
                                                    iVar44 = ptls_buffer__do_pushv
                                                                       (ppVar127,&local_c5,1);
                                                    puVar75 = local_768;
                                                    if (iVar44 == 0) {
                                                      lVar67 = ppVar127->off - session_id._24_8_;
                                                      ppVar127->base[session_id._24_8_ + -2] =
                                                           (uint8_t)((ulong)lVar67 >> 8);
                                                      ppVar127->base[session_id._24_8_ + -1] =
                                                           (uint8_t)lVar67;
                                                      session_id._24_8_ = ppVar127->off;
                                                      sStack_770 = 0x111c45;
                                                      iVar44 = ptls_buffer__do_pushv(ppVar127,"",1);
                                                      puVar75 = local_768;
                                                      if (iVar44 == 0) {
                                                        sVar133 = ppVar127->off;
                                                        sVar73 = (*tls->ctx->cipher_suites)->hash->
                                                                 digest_size;
                                                        sStack_770 = 0x111c78;
                                                        iVar44 = ptls_buffer_reserve(ppVar127,sVar73
                                                                                    );
                                                        puVar75 = local_768;
                                                        if (iVar44 == 0) {
                                                          pVar136.len = session_id._24_8_ - sVar131;
                                                          sStack_770 = 0x111ca8;
                                                          pVar136.base = ppVar127->base + sVar131;
                                                          iVar44 = calc_cookie_signature
                                                                             (tls,properties,
                                                                              negotiated_group,
                                                                              pVar136,ppVar127->base
                                                                                      + ppVar127->
                                                                                        off);
                                                          puVar75 = local_768;
                                                          if (iVar44 == 0) {
                                                            sVar73 = sVar73 + ppVar127->off;
                                                            ppVar127->off = sVar73;
                                                            ppVar127->base[sVar133 - 1] =
                                                                 (char)sVar73 - (char)sVar133;
                                                            lVar67 = ppVar127->off - sVar131;
                                                            ppVar127->base[sVar131 - 2] =
                                                                 (uint8_t)((ulong)lVar67 >> 8);
                                                            ppVar127->base[sVar131 - 1] =
                                                                 (uint8_t)lVar67;
                                                            lVar67 = ppVar127->off - sVar130;
                                                            ppVar127->base[sVar130 - 2] =
                                                                 (uint8_t)((ulong)lVar67 >> 8);
                                                            ppVar127->base[sVar130 - 1] =
                                                                 (uint8_t)lVar67;
                                                            uVar68 = emitter->buf->off -
                                                                     (long)local_60;
                                                            for (lVar67 = 8; lVar67 != -8;
                                                                lVar67 = lVar67 + -8) {
                                                              emitter->buf->base[(long)local_60 - 2]
                                                                   = (uint8_t)(uVar68 >>
                                                                              ((byte)lVar67 & 0x3f))
                                                              ;
                                                              local_60 = (ptls_esni_context_t **)
                                                                         ((long)local_60 + 1);
                                                            }
                                                            uVar68 = ppVar134->off - local_68;
                                                            for (; tbs_start != 0xfffffffffffffff8;
                                                                tbs_start = tbs_start - 8) {
                                                              ppVar134->base[local_68 - 3] =
                                                                   (uint8_t)(uVar68 >>
                                                                            ((byte)tbs_start & 0x3f)
                                                                            );
                                                              local_68 = local_68 + 1;
                                                            }
                                                            sStack_770 = 0x112145;
                                                            iVar44 = (*emitter->commit_message)
                                                                               (emitter);
                                                            puVar75 = local_768;
                                                            if (iVar44 == 0) {
                                                              sStack_770 = 0x11215a;
                                                              iVar45 = push_change_cipher_spec
                                                                                 (tls,emitter);
                                                              puVar75 = local_768;
                                                              iVar44 = 0x206;
                                                              if (iVar45 != 0) {
                                                                puVar75 = local_768;
                                                                iVar44 = iVar45;
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0010efba;
              }
            }
          }
          lVar67 = (long)puVar126 - lVar67;
          iVar44 = 0x32;
          sStack_770 = 0x28;
          iVar45 = 0x28;
LAB_00110fae:
          puVar75 = puVar107;
          if (lVar67 == 0) {
            iVar44 = iVar45;
          }
          goto LAB_0010efba;
        }
LAB_00110069:
        puVar75 = puVar59;
        bVar135 = false;
LAB_00110070:
        puVar107 = puVar75;
        *(undefined8 *)(puVar107 + -8) = 0x110084;
        iVar44 = report_unknown_extensions(tls,properties,(ptls_raw_extension_t *)(__dest + 0x1b0));
        puVar75 = puVar107;
        if (iVar44 != 0) goto LAB_0010efba;
        bVar39 = false;
        if ((((bVar135) && (lVar67 = *(long *)(__dest + 0x14c), lVar67 != 0)) &&
            ((__dest[0x1a4] & 3) != 0)) &&
           ((ppVar63 = tls->ctx, ppVar63->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0 &&
            ((ppVar63->field_0x70 & 8) == 0)))) {
          psVar16 = ppVar63->get_time;
          p_Var17 = psVar16->cb;
          *(undefined8 *)(puVar107 + -8) = 0x1100e4;
          uVar56 = (*p_Var17)(psVar16);
          _auStack_a8 = (st_ptls_aead_algorithm_t *)0x130876;
          session_id.base = (uint8_t *)0x0;
          session_id.capacity = 0;
          session_id.off._0_4_ = 0;
          for (local_48 = (st_ptls_aead_algorithm_t *)0x0; local_48 < *(ulong *)(__dest + 0x1a0);
              local_48 = (st_ptls_aead_algorithm_t *)((long)local_48 + 1)) {
            lVar132 = (long)local_48 * 0x28;
            session_id.capacity = 0;
            psVar18 = tls->ctx->encrypt_ticket;
            puVar59 = *(uint8_t **)(session_id._24_8_ + lVar132);
            sVar130 = *(size_t *)(session_id._24_8_ + 8 + lVar132);
            p_Var19 = psVar18->cb;
            *(undefined8 *)(puVar107 + -8) = 0x11014d;
            pVar138.len = sVar130;
            pVar138.base = puVar59;
            iVar44 = (*p_Var19)(psVar18,tls,0,(ptls_buffer_t *)auStack_a8,pVar138);
            psVar48 = _auStack_a8;
            if (iVar44 == 0) {
              bVar64 = 1;
LAB_00110164:
              *(uint8_t **)(puVar107 + -0x10) =
                   (uint8_t *)((long)&_auStack_a8->name + session_id.capacity);
              *(st_ptls_aead_algorithm_t **)(puVar107 + -0x18) = psVar48;
              *(size_t **)(puVar107 + -0x20) = &ticket_server_name.len;
              *(undefined8 *)(puVar107 + -0x28) = 0x1101b3;
              iVar44 = decode_session_identifier
                                 (&local_f0,(ptls_iovec_t *)&stack0xffffffffffffff00,&local_bc,
                                  (ptls_iovec_t *)local_1d8,&local_ac,&local_aa,
                                  *(ptls_iovec_t **)(puVar107 + -0x20),
                                  *(uint8_t **)(puVar107 + -0x18),*(uint8_t **)(puVar107 + -0x10));
              puVar59 = ticket_server_name.base;
              if (iVar44 == 0) {
                uVar68 = CONCAT44(local_f0._4_4_,
                                  CONCAT22(local_f0._2_2_,
                                           CONCAT11(local_f0._1_1_,(undefined1)local_f0)));
                if ((uVar68 <= uVar56) &&
                   (ppVar63 = tls->ctx, uVar56 - uVar68 <= (ulong)ppVar63->ticket_lifetime * 1000))
                {
                  bVar39 = false;
                  if (!(bool)(bVar64 ^ 1) && (__dest[0x1a6] & 1) != 0) {
                    uVar66 = uVar56 - (uVar68 + (*(int *)(session_id._24_8_ + lVar132 + 0x10) -
                                                local_bc));
                    uVar68 = -uVar66;
                    if (0 < (long)uVar66) {
                      uVar68 = uVar66;
                    }
                    bVar39 = uVar68 < 0x2711 && ppVar63->max_early_data_size != 0;
                  }
                  pcVar14 = tls->server_name;
                  if (ticket_server_name.base == (uint8_t *)0x0) {
                    if (pcVar14 == (char *)0x0) {
LAB_00110282:
                      puVar59 = ticket_negotiated_protocol.base;
                      pppVar57 = ppVar63->key_exchanges;
                      do {
                        ppVar20 = *pppVar57;
                        if (ppVar20 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_001101e5;
                        pppVar57 = pppVar57 + 1;
                      } while (ppVar20->id != local_ac);
                      tls->key_share = ppVar20;
                      if (local_aa == tls->cipher_suite->id) {
                        if (ticket_negotiated_protocol.base == (uint8_t *)0x0) {
LAB_001102fc:
                          sVar60.bits = _local_100;
                          ppVar55 = tls->key_schedule;
                          if ((bitmap.bits == (uint8_t  [8])(ppVar55->hashes[0].algo)->digest_size)
                             && (*(uint8_t (*) [8])(session_id._24_8_ + 0x20 + lVar132) ==
                                 bitmap.bits)) {
                            *(undefined8 *)(puVar107 + -8) = 0x110334;
                            ikm_00.len._0_1_ = bitmap.bits[0];
                            ikm_00.len._1_1_ = bitmap.bits[1];
                            ikm_00.len._2_1_ = bitmap.bits[2];
                            ikm_00.len._3_1_ = bitmap.bits[3];
                            ikm_00.len._4_1_ = bitmap.bits[4];
                            ikm_00.len._5_1_ = bitmap.bits[5];
                            ikm_00.len._6_1_ = bitmap.bits[6];
                            ikm_00.len._7_1_ = bitmap.bits[7];
                            ikm_00.base = (uint8_t *)sVar60.bits;
                            iVar44 = key_schedule_extract(ppVar55,ikm_00);
                            if (iVar44 == 0) {
                              ppVar55 = tls->key_schedule;
                              *(undefined8 *)(puVar107 + -8) = 0x110353;
                              iVar44 = derive_secret(ppVar55,&stack0xfffffffffffffd98,"res binder");
                              if (iVar44 == 0) {
                                ppVar55 = tls->key_schedule;
                                *(undefined8 *)(puVar107 + -8) = 0x11036b;
                                ptls__key_schedule_update_hash
                                          (ppVar55,(uint8_t *)msg,lVar67 - (long)msg);
                                ppVar55 = tls->key_schedule;
                                *(undefined8 *)(puVar107 + -8) = 0x11037e;
                                iVar44 = calc_verify_data(&stack0xfffffffffffffd98,ppVar55,
                                                          &stack0xfffffffffffffd98);
                                if (iVar44 == 0) {
                                  pvVar25 = *(void **)(session_id._24_8_ + 0x18 + lVar132);
                                  sVar130 = (tls->key_schedule->hashes[0].algo)->digest_size;
                                  *(undefined8 *)(puVar107 + -8) = 0x11153f;
                                  iVar45 = (*ptls_mem_equal)(pvVar25,&stack0xfffffffffffffd98,
                                                             sVar130);
                                  *(undefined8 *)(puVar107 + -8) = 0x33;
                                  iVar44 = (int)*(undefined8 *)(puVar107 + -8);
                                  if (iVar45 != 0) {
                                    iVar44 = 0;
                                  }
                                }
                              }
                            }
                            goto LAB_00110be0;
                          }
                        }
                        else {
                          pcVar14 = tls->negotiated_protocol;
                          if (pcVar14 != (char *)0x0) {
                            x_00.base._4_4_ = ticket_server_name.len._4_4_;
                            x_00.base._0_4_ = (uint)ticket_server_name.len;
                            *(undefined8 *)(puVar107 + -8) = 0x1102f4;
                            x_00.len = (size_t)puVar59;
                            iVar44 = vec_is_string(x_00,pcVar14);
                            if (iVar44 != 0) goto LAB_001102fc;
                          }
                        }
                      }
                    }
                  }
                  else if (pcVar14 != (char *)0x0) {
                    x.base._4_4_ = local_1d8._4_4_;
                    x.base._0_4_ = local_1d8._0_4_;
                    *(undefined8 *)(puVar107 + -8) = 0x110270;
                    x.len = (size_t)puVar59;
                    iVar44 = vec_is_string(x,pcVar14);
                    if (iVar44 != 0) goto LAB_00110282;
                  }
                }
              }
            }
            else if (iVar44 == 0x209) {
              bVar64 = 0;
              goto LAB_00110164;
            }
LAB_001101e5:
          }
          tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
          bVar39 = false;
          *(undefined8 *)(puVar107 + -8) = 0xffffffffffffffff;
          local_48 = *(st_ptls_aead_algorithm_t **)(puVar107 + -8);
          iVar44 = 0;
LAB_00110be0:
          *(undefined8 *)(puVar107 + -8) = 0x110bec;
          ptls_buffer_dispose((ptls_buffer_t *)auStack_a8);
          *(undefined8 *)(puVar107 + -8) = 0x40;
          sVar130 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x110bff;
          (*ptls_clear_memory)(&stack0xfffffffffffffd98,sVar130);
          if (iVar44 != 0) goto LAB_0010efba;
          if (local_48 == (st_ptls_aead_algorithm_t *)0xffffffffffffffff) goto LAB_00110c54;
          if ((tls->ctx->field_0x70 & 8) != 0) goto LAB_00110c5b;
          ppVar55 = tls->key_schedule;
          puVar59 = *(uint8_t **)(__dest + 0x14c);
          *(undefined8 *)(puVar107 + -8) = 0x110c37;
          ptls__key_schedule_update_hash(ppVar55,puVar59,(long)psVar4 - (long)puVar59);
          if ((*(uint *)(__dest + 0x1a4) & 1) == 0) {
            if ((*(uint *)(__dest + 0x1a4) & 2) == 0) {
              *(undefined8 *)(puVar107 + -8) = 0x1118ff;
              __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                            ,0xf8e,
                            "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                           );
            }
            *(undefined8 *)(puVar107 + -8) = 2;
          }
          else {
            *(undefined8 *)(puVar107 + -8) = 1;
          }
          iVar45 = (int)*(undefined8 *)(puVar107 + -8);
          tls->field_0x160 = tls->field_0x160 | 2;
          if (properties != (ptls_handshake_properties_t *)0x0) {
            pvVar25 = *(void **)(session_id._24_8_ + 0x18 + (long)local_48 * 0x28);
            sVar54 = *(size_t *)(session_id._24_8_ + 0x20 + (long)local_48 * 0x28);
            *(undefined8 *)(puVar107 + -8) = 0x11142f;
            memcpy(properties,pvVar25,sVar54);
            goto LAB_00110c9b;
          }
        }
        else {
LAB_00110c54:
          *(undefined8 *)(puVar107 + -8) = 0xffffffffffffffff;
          local_48 = *(st_ptls_aead_algorithm_t **)(puVar107 + -8);
LAB_00110c5b:
          ppVar55 = tls->key_schedule;
          *(undefined8 *)(puVar107 + -8) = 0x110c6e;
          ptls__key_schedule_update_hash(ppVar55,(uint8_t *)msg,(size_t)msglen);
          if (bVar135) {
            ppVar55 = tls->key_schedule;
            if (ppVar55->generation != 0) {
              *(undefined8 *)(puVar107 + -8) = 0x111740;
              __assert_fail("tls->key_schedule->generation == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                            ,0xf83,
                            "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                           );
            }
            *(undefined8 *)(puVar107 + -8) = 0x110c8e;
            key_schedule_extract(ppVar55,(ptls_iovec_t)ZEXT816(0));
          }
          iVar45 = 0;
          if (properties != (ptls_handshake_properties_t *)0x0) {
            sVar54 = 0;
            iVar45 = 0;
LAB_00110c9b:
            *(size_t *)((long)&properties->field_0 + 0x40) = sVar54;
          }
        }
        if (((bVar39) && (local_48 == (st_ptls_aead_algorithm_t *)0x0)) &&
           (tls->ctx->max_early_data_size != 0)) {
          *(undefined8 *)(puVar107 + -8) = 0x40;
          sVar54 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x110cc5;
          puVar59 = (uint8_t *)malloc(sVar54);
          tls->pending_handshake_secret = puVar59;
          iVar44 = 0x201;
          if (puVar59 == (uint8_t *)0x0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 1;
          uVar32 = *(undefined8 *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x110ceb;
          iVar44 = derive_exporter_secret(tls,(int)uVar32);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 1;
          sVar130 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x110d0b;
          iVar44 = setup_traffic_protection(tls,0,"c e traffic",sVar130,0);
          if (iVar44 != 0) goto LAB_0010efba;
        }
        ppVar20 = ppStack_188;
        if (iVar45 != 1) {
          if (ppStack_188 == (st_ptls_key_exchange_algorithm_t *)0x0) {
            lVar67 = *(long *)(__dest + 0x2c);
            *(undefined8 *)(puVar107 + -8) = 0x6d;
            iVar45 = (int)*(undefined8 *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x28;
            iVar44 = (int)*(undefined8 *)(puVar107 + -8);
            goto LAB_00110fae;
          }
          pVar36.len = (size_t)key_share.peer_key.base;
          pVar36.base = (uint8_t *)key_share.algorithm;
          p_Var23 = ppStack_188->exchange;
          *(undefined8 *)(puVar107 + -8) = 0x110f8a;
          iVar44 = (*p_Var23)(ppVar20,(ptls_iovec_t *)&ticket_negotiated_protocol.len,
                              (ptls_iovec_t *)auStack_168,pVar36);
          if (iVar44 != 0) goto LAB_0010efba;
          tls->key_share = ppVar20;
        }
        p_Var21 = emitter->begin_message;
        *(undefined8 *)(puVar107 + -8) = 0x110d24;
        iVar44 = (*p_Var21)(emitter);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar134 = emitter->buf;
        ppVar55 = tls->key_schedule;
        sVar130 = ppVar134->off;
        local_c2 = 2;
        *(undefined8 *)(puVar107 + -8) = 1;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110d58;
        iVar44 = ptls_buffer__do_pushv(ppVar134,&local_c2,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        *(undefined8 *)(puVar107 + -8) = 3;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110d72;
        iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        tbs_start = ppVar134->off;
        ppVar127 = emitter->buf;
        local_124 = 0x303;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110d9d;
        iVar44 = ptls_buffer__do_pushv(ppVar127,&local_124,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        *(undefined8 *)(puVar107 + -8) = 0x20;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110db4;
        iVar44 = ptls_buffer_reserve(ppVar127,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar63 = tls->ctx;
        puVar59 = emitter->buf->base;
        sVar131 = emitter->buf->off;
        *(undefined8 *)(puVar107 + -8) = 0x20;
        sVar133 = *(size_t *)(puVar107 + -8);
        p_Var22 = ppVar63->random_bytes;
        *(undefined8 *)(puVar107 + -8) = 0x110dd7;
        (*p_Var22)(puVar59 + sVar131,sVar133);
        ppVar127 = emitter->buf;
        psVar3 = &ppVar127->off;
        *psVar3 = *psVar3 + 0x20;
        *(undefined8 *)(puVar107 + -8) = 1;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110def;
        iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        sVar131 = ppVar127->off;
        pvVar25 = *(void **)(__dest + 8);
        sVar133 = *(size_t *)(__dest + 0xc);
        *(undefined8 *)(puVar107 + -8) = 0x110e13;
        iVar44 = ptls_buffer__do_pushv(ppVar127,pvVar25,sVar133);
        if (iVar44 != 0) goto LAB_0010efba;
        emitter->buf->base[sVar131 - 1] = (char)(int)emitter->buf->off - (char)sVar131;
        uVar40 = tls->cipher_suite->id;
        ppVar127 = emitter->buf;
        local_122 = uVar40 << 8 | uVar40 >> 8;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110e59;
        iVar44 = ptls_buffer__do_pushv(ppVar127,&local_122,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        local_c1 = 0;
        *(undefined8 *)(puVar107 + -8) = 1;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110e7a;
        iVar44 = ptls_buffer__do_pushv(ppVar127,&local_c1,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110e98;
        iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        local_60 = (ptls_esni_context_t **)ppVar127->off;
        local_120 = 0x2b00;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110ec3;
        iVar44 = ptls_buffer__do_pushv(ppVar127,&local_120,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110ee1;
        iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar127 = emitter->buf;
        local_68 = ppVar127->off;
        local_11e = __dest[0x18] << 8 | __dest[0x18] >> 8;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x110f12;
        iVar44 = ptls_buffer__do_pushv(ppVar127,&local_11e,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        uVar68 = emitter->buf->off - local_68;
        *(undefined8 *)(puVar107 + -8) = 8;
        for (lVar67 = *(long *)(puVar107 + -8); lVar67 != -8; lVar67 = lVar67 + -8) {
          emitter->buf->base[local_68 - 2] = (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
          local_68 = local_68 + 1;
        }
        ppVar127 = emitter->buf;
        if (iVar45 == 1) {
LAB_00111565:
          local_118 = 0x2900;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar131 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x11157d;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_118,sVar131);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar131 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111598;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
          if (iVar44 != 0) goto LAB_0010efba;
          sVar131 = ppVar127->off;
          local_116 = (ushort)local_48 << 8 | (ushort)local_48 >> 8;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x1115c6;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_116,sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          lVar67 = ppVar127->off - sVar131;
          ppVar127->base[sVar131 - 2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[sVar131 - 1] = (uint8_t)lVar67;
        }
        else {
          local_11c = 0x3300;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar131 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111608;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_11c,sVar131);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar131 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111623;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
          if (iVar44 != 0) goto LAB_0010efba;
          sVar131 = ppVar127->off;
          local_11a = ppStack_188->id << 8 | ppStack_188->id >> 8;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111657;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_11a,sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111672;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
          sVar133 = ticket_negotiated_protocol.len;
          if (iVar44 != 0) goto LAB_0010efba;
          session_id._24_8_ = ppVar127->off;
          *(undefined8 *)(puVar107 + -8) = 0x111699;
          iVar44 = ptls_buffer__do_pushv(ppVar127,(void *)sVar133,0);
          if (iVar44 != 0) goto LAB_0010efba;
          lVar67 = ppVar127->off - session_id._24_8_;
          ppVar127->base[session_id._24_8_ + -2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[session_id._24_8_ + -1] = (uint8_t)lVar67;
          lVar67 = ppVar127->off - sVar131;
          ppVar127->base[sVar131 - 2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[sVar131 - 1] = (uint8_t)lVar67;
          if (iVar45 != 0) goto LAB_00111565;
        }
        uVar68 = emitter->buf->off - (long)local_60;
        *(undefined8 *)(puVar107 + -8) = 8;
        for (lVar67 = *(long *)(puVar107 + -8); lVar67 != -8; lVar67 = lVar67 + -8) {
          emitter->buf->base[(long)local_60 - 2] = (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
          local_60 = (ptls_esni_context_t **)((long)local_60 + 1);
        }
        uVar68 = ppVar134->off - tbs_start;
        *(undefined8 *)(puVar107 + -8) = 0x10;
        for (lVar67 = *(long *)(puVar107 + -8); lVar67 != -8; lVar67 = lVar67 + -8) {
          ppVar134->base[tbs_start - 3] = (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
          tbs_start = tbs_start + 1;
        }
        if (ppVar55 != (ptls_key_schedule_t *)0x0) {
          puVar59 = ppVar134->base;
          sVar131 = ppVar134->off;
          *(undefined8 *)(puVar107 + -8) = 0x111d62;
          ptls__key_schedule_update_hash(ppVar55,puVar59 + sVar130,sVar131 - sVar130);
        }
        p_Var21 = emitter->commit_message;
        *(undefined8 *)(puVar107 + -8) = 0x111d69;
        iVar44 = (*p_Var21)(emitter);
        if (iVar44 != 0) goto LAB_0010efba;
        *(undefined8 *)(puVar107 + -8) = 0x111d7e;
        iVar44 = push_change_cipher_spec(tls,emitter);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar55 = tls->key_schedule;
        if (ppVar55->generation != 1) {
          *(undefined8 *)(puVar107 + -8) = 0x111f08;
          __assert_fail("tls->key_schedule->generation == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                        ,0xfc3,
                        "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                       );
        }
        ikm.len = (size_t)ecdh_secret.base;
        ikm.base = (uint8_t *)auStack_168;
        *(undefined8 *)(puVar107 + -8) = 0x111daa;
        key_schedule_extract(ppVar55,ikm);
        *(undefined8 *)(puVar107 + -8) = 1;
        uVar32 = *(undefined8 *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar130 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x111dc3;
        iVar44 = setup_traffic_protection(tls,(int)uVar32,"s hs traffic",sVar130,0);
        if (iVar44 != 0) goto LAB_0010efba;
        puVar59 = tls->pending_handshake_secret;
        if (puVar59 == (uint8_t *)0x0) {
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar130 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111f20;
          iVar44 = setup_traffic_protection(tls,0,"c hs traffic",sVar130,0);
          if (iVar44 != 0) goto LAB_0010efba;
          if ((__dest[0x1a6] & 1) != 0) {
            (tls->field_18).server.early_data_skipped_bytes = 0;
          }
        }
        else {
          ppVar55 = tls->key_schedule;
          *(undefined8 *)(puVar107 + -8) = 0x111df3;
          iVar44 = derive_secret(ppVar55,puVar59,"c hs traffic");
          if (iVar44 != 0) goto LAB_0010efba;
          psVar26 = tls->ctx->update_traffic_key;
          if (psVar26 != (st_ptls_update_traffic_key_t *)0x0) {
            puVar59 = tls->pending_handshake_secret;
            *(undefined8 *)(puVar107 + -8) = 2;
            sVar130 = *(size_t *)(puVar107 + -8);
            p_Var27 = psVar26->cb;
            *(undefined8 *)(puVar107 + -8) = 0x111e24;
            iVar44 = (*p_Var27)(psVar26,tls,0,sVar130,puVar59);
            if (iVar44 != 0) goto LAB_0010efba;
          }
        }
        p_Var21 = emitter->begin_message;
        *(undefined8 *)(puVar107 + -8) = 0x111f43;
        iVar44 = (*p_Var21)(emitter);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar134 = emitter->buf;
        ppVar55 = tls->key_schedule;
        sVar130 = ppVar134->off;
        local_c0 = 8;
        *(undefined8 *)(puVar107 + -8) = 1;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x111f7c;
        iVar44 = ptls_buffer__do_pushv(ppVar134,&local_c0,sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        *(undefined8 *)(puVar107 + -8) = 3;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x111f97;
        iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        local_58 = (st_ptls_aead_algorithm_t *)ppVar134->off;
        ppVar127 = emitter->buf;
        *(undefined8 *)(puVar107 + -8) = 2;
        sVar131 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x111fc4;
        iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
        if (iVar44 != 0) goto LAB_0010efba;
        sVar131 = ppVar127->off;
        if (tls->esni == (ptls_esni_secret_t *)0x0) {
          if (tls->server_name != (char *)0x0) {
            local_112 = 0;
            *(undefined8 *)(puVar107 + -8) = 2;
            sVar133 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x112193;
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_112,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            *(undefined8 *)(puVar107 + -8) = 2;
            sVar133 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x1121ad;
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            sVar133 = ppVar127->off;
            *(undefined8 *)(puVar107 + -8) = 0xfffffffffffffffe;
            for (lVar67 = *(long *)(puVar107 + -8); lVar67 != 0; lVar67 = lVar67 + 1) {
              ppVar127->base[lVar67 + sVar133] = '\0';
            }
          }
        }
        else {
          local_114 = 0xceff;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x111ffd;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_114,sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x112017;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          sVar133 = ppVar127->off;
          psStack_268 = (st_ptls_aead_algorithm_t *)((ulong)psStack_268 & 0xffffffffffffff00);
          *(undefined8 *)(puVar107 + -8) = 1;
          sVar73 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x11203c;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&stack0xfffffffffffffd98,sVar73);
          if (iVar44 != 0) goto LAB_0010efba;
          ppVar28 = tls->esni;
          *(undefined8 *)(puVar107 + -8) = 0x10;
          sVar73 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x112061;
          iVar44 = ptls_buffer__do_pushv(ppVar127,ppVar28->nonce,sVar73);
          if (iVar44 != 0) goto LAB_0010efba;
          lVar67 = ppVar127->off - sVar133;
          ppVar127->base[sVar133 - 2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[sVar133 - 1] = (uint8_t)lVar67;
          *(undefined8 *)(puVar107 + -8) = 1;
          uVar32 = *(undefined8 *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x11208d;
          free_esni_secret(&tls->esni,(int)uVar32);
        }
        if ((tls->ctx->field_0x70 & 0x20) != 0) {
          local_110 = 0x1400;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x112238;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_110,sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x112252;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          sVar133 = ppVar127->off;
          local_bf = 2;
          *(undefined8 *)(puVar107 + -8) = 1;
          sVar73 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x112273;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_bf,sVar73);
          if (iVar44 != 0) goto LAB_0010efba;
          lVar67 = ppVar127->off - sVar133;
          ppVar127->base[sVar133 - 2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[sVar133 - 1] = (uint8_t)lVar67;
        }
        if (tls->negotiated_protocol != (char *)0x0) {
          local_10e = 0x1000;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x1122bd;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_10e,sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x1122d7;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          sVar133 = ppVar127->off;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar73 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x1122f9;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar73);
          if (iVar44 != 0) goto LAB_0010efba;
          session_id._24_8_ = ppVar127->off;
          *(undefined8 *)(puVar107 + -8) = 1;
          sVar73 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x11231b;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar73);
          if (iVar44 != 0) goto LAB_0010efba;
          sVar73 = ppVar127->off;
          pcVar14 = tls->negotiated_protocol;
          *(undefined8 *)(puVar107 + -8) = 0x11233e;
          sVar54 = strlen(pcVar14);
          *(undefined8 *)(puVar107 + -8) = 0x11234c;
          iVar44 = ptls_buffer__do_pushv(ppVar127,pcVar14,sVar54);
          if (iVar44 != 0) goto LAB_0010efba;
          ppVar127->base[sVar73 - 1] = (char)(int)ppVar127->off - (char)sVar73;
          lVar67 = ppVar127->off - session_id._24_8_;
          ppVar127->base[session_id._24_8_ + -2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[session_id._24_8_ + -1] = (uint8_t)lVar67;
          lVar67 = ppVar127->off - sVar133;
          ppVar127->base[sVar133 - 2] = (uint8_t)((ulong)lVar67 >> 8);
          ppVar127->base[sVar133 - 1] = (uint8_t)lVar67;
        }
        if (tls->pending_handshake_secret != (uint8_t *)0x0) {
          local_10c = 0x2a00;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x1123bc;
          iVar44 = ptls_buffer__do_pushv(ppVar127,&local_10c,sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 2;
          sVar133 = *(size_t *)(puVar107 + -8);
          *(undefined8 *)(puVar107 + -8) = 0x1123d6;
          iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
          if (iVar44 != 0) goto LAB_0010efba;
          *(undefined8 *)(puVar107 + -8) = 0xfffffffffffffffe;
          sVar133 = ppVar127->off;
          for (lVar67 = *(long *)(puVar107 + -8); lVar67 != 0; lVar67 = lVar67 + 1) {
            ppVar127->base[lVar67 + sVar133] = '\0';
          }
        }
        *(undefined8 *)(puVar107 + -8) = 0x112405;
        iVar44 = push_additional_extensions(properties,ppVar127);
        if (iVar44 != 0) goto LAB_0010efba;
        lVar67 = ppVar127->off - sVar131;
        ppVar127->base[sVar131 - 2] = (uint8_t)((ulong)lVar67 >> 8);
        ppVar127->base[sVar131 - 1] = (uint8_t)lVar67;
        uVar68 = ppVar134->off - (long)local_58;
        *(undefined8 *)(puVar107 + -8) = 0x10;
        for (lVar67 = *(long *)(puVar107 + -8); lVar67 != -8; lVar67 = lVar67 + -8) {
          ppVar134->base[(long)local_58 - 3] = (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
          local_58 = (st_ptls_aead_algorithm_t *)((long)local_58 + 1);
        }
        if (ppVar55 != (ptls_key_schedule_t *)0x0) {
          puVar59 = ppVar134->base;
          sVar131 = ppVar134->off;
          *(undefined8 *)(puVar107 + -8) = 0x112482;
          ptls__key_schedule_update_hash(ppVar55,puVar59 + sVar130,sVar131 - sVar130);
        }
        p_Var21 = emitter->commit_message;
        *(undefined8 *)(puVar107 + -8) = 0x112489;
        iVar44 = (*p_Var21)(emitter);
        if (iVar44 != 0) goto LAB_0010efba;
        if (iVar45 == 0) {
          if ((tls->ctx->field_0x70 & 8) != 0) {
            p_Var21 = emitter->begin_message;
            *(undefined8 *)(puVar107 + -8) = 0x1124b2;
            iVar44 = (*p_Var21)(emitter);
            if (iVar44 != 0) goto LAB_0010efba;
            ppVar134 = emitter->buf;
            ppVar55 = tls->key_schedule;
            sVar130 = ppVar134->off;
            local_be = 0xd;
            *(undefined8 *)(puVar107 + -8) = 1;
            sVar131 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x1124eb;
            iVar44 = ptls_buffer__do_pushv(ppVar134,&local_be,sVar131);
            if (iVar44 != 0) goto LAB_0010efba;
            *(undefined8 *)(puVar107 + -8) = 3;
            sVar131 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x112505;
            iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar131);
            if (iVar44 != 0) goto LAB_0010efba;
            local_80 = ppVar134->off;
            ppVar127 = emitter->buf;
            local_bd = 0;
            *(undefined8 *)(puVar107 + -8) = 1;
            sVar131 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x112532;
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_bd,sVar131);
            if (iVar44 != 0) goto LAB_0010efba;
            *(undefined8 *)(puVar107 + -8) = 2;
            sVar131 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x11254c;
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar131);
            if (iVar44 != 0) goto LAB_0010efba;
            sVar131 = ppVar127->off;
            local_10a = 0xd00;
            *(undefined8 *)(puVar107 + -8) = 2;
            sVar133 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x112573;
            iVar44 = ptls_buffer__do_pushv(ppVar127,&local_10a,sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            *(undefined8 *)(puVar107 + -8) = 2;
            sVar133 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x11258d;
            iVar44 = ptls_buffer__do_pushv(ppVar127,"",sVar133);
            if (iVar44 != 0) goto LAB_0010efba;
            sVar133 = ppVar127->off;
            vc = tls->ctx->verify_certificate;
            *(undefined8 *)(puVar107 + -8) = 0x1125ac;
            iVar44 = push_signature_algorithms(vc,ppVar127);
            if (iVar44 != 0) goto LAB_0010efba;
            lVar67 = ppVar127->off - sVar133;
            ppVar127->base[sVar133 - 2] = (uint8_t)((ulong)lVar67 >> 8);
            ppVar127->base[sVar133 - 1] = (uint8_t)lVar67;
            lVar67 = ppVar127->off - sVar131;
            ppVar127->base[sVar131 - 2] = (uint8_t)((ulong)lVar67 >> 8);
            ppVar127->base[sVar131 - 1] = (uint8_t)lVar67;
            uVar68 = ppVar134->off - local_80;
            *(undefined8 *)(puVar107 + -8) = 0x10;
            for (lVar67 = *(long *)(puVar107 + -8); lVar67 != -8; lVar67 = lVar67 + -8) {
              ppVar134->base[local_80 - 3] = (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
              local_80 = local_80 + 1;
            }
            if (ppVar55 != (ptls_key_schedule_t *)0x0) {
              puVar59 = ppVar134->base;
              sVar131 = ppVar134->off;
              *(undefined8 *)(puVar107 + -8) = 0x11263a;
              ptls__key_schedule_update_hash(ppVar55,puVar59 + sVar130,sVar131 - sVar130);
            }
            p_Var21 = emitter->commit_message;
            *(undefined8 *)(puVar107 + -8) = 0x112641;
            iVar44 = (*p_Var21)(emitter);
            if (iVar44 != 0) goto LAB_0010efba;
          }
          signature_algorithms = local_d8;
          uVar40 = __dest[0x27c];
          *(undefined8 *)(puVar107 + -0x10) = *(undefined8 *)(__dest + 0x100);
          *(ushort **)(puVar107 + -0x18) = __dest + 0xf0;
          *(ulong *)(puVar107 + -0x20) = (ulong)((byte)uVar40 & 1);
          *(undefined8 *)(puVar107 + -0x28) = 0x112684;
          iVar44 = send_certificate_and_certificate_verify
                             (tls,emitter,signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                              "TLS 1.3, server CertificateVerify",*(int *)(puVar107 + -0x20),
                              *(uint16_t **)(puVar107 + -0x18),*(size_t *)(puVar107 + -0x10));
          if (iVar44 != 0) goto LAB_0010efba;
        }
        *(undefined8 *)(puVar107 + -8) = 0x11269d;
        iVar44 = send_finished(tls,emitter);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar55 = tls->key_schedule;
        if (ppVar55->generation != 2) {
          *(undefined8 *)(puVar107 + -8) = 0x112763;
          __assert_fail("tls->key_schedule->generation == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                        ,0x101d,
                        "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                       );
        }
        *(undefined8 *)(puVar107 + -8) = 0x1126bf;
        iVar44 = key_schedule_extract(ppVar55,(ptls_iovec_t)ZEXT816(0));
        if (iVar44 != 0) goto LAB_0010efba;
        *(undefined8 *)(puVar107 + -8) = 1;
        uVar32 = *(undefined8 *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 3;
        sVar130 = *(size_t *)(puVar107 + -8);
        *(undefined8 *)(puVar107 + -8) = 0x1126e0;
        iVar44 = setup_traffic_protection(tls,(int)uVar32,"s ap traffic",sVar130,0);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar55 = tls->key_schedule;
        *(undefined8 *)(puVar107 + -8) = 0x112703;
        iVar44 = derive_secret(ppVar55,&tls->field_18,"c ap traffic");
        if (iVar44 != 0) goto LAB_0010efba;
        *(undefined8 *)(puVar107 + -8) = 0x112716;
        iVar44 = derive_exporter_secret(tls,0);
        if (iVar44 != 0) goto LAB_0010efba;
        ppVar63 = tls->ctx;
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
          if ((ppVar63->field_0x70 & 8) == 0) {
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          }
          else {
            tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
          }
        }
        else if ((ppVar63->field_0x70 & 0x10) == 0) {
          tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
        else {
          *(undefined8 *)(puVar107 + -8) = 0x11277e;
          iVar44 = commission_handshake_secret(tls);
          if (iVar44 != 0) goto LAB_0010efba;
          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          ppVar63 = tls->ctx;
        }
        if ((*(int *)(__dest + 0x1a4) != 0) && (ppVar63->ticket_lifetime != 0)) {
          psVar61 = tls->key_schedule->hashes[0].ctx;
          p_Var29 = psVar61->clone_;
          *(undefined8 *)(puVar107 + -8) = 0x1127c7;
          psVar61 = (*p_Var29)(psVar61);
          ppVar63 = tls->ctx;
          if (ppVar63->ticket_lifetime == 0) {
            *(undefined8 *)(puVar107 + -8) = 0x112891;
            __assert_fail("tls->ctx->ticket_lifetime != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0x590,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
          }
          if (ppVar63->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
            *(undefined8 *)(puVar107 + -8) = 0x1128b0;
            __assert_fail("tls->ctx->encrypt_ticket != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0x591,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
          }
          ppVar134 = emitter->buf;
          sVar130 = ppVar134->off;
          if ((tls->pending_handshake_secret == (uint8_t *)0x0) ||
             ((ppVar63->field_0x70 & 0x10) != 0)) {
LAB_001128f4:
            ppVar55 = tls->key_schedule;
            local_aa = CONCAT11(local_aa._1_1_,0x14);
            *(undefined8 *)(puVar107 + -8) = 1;
            sVar131 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x112915;
            iVar44 = ptls_buffer__do_pushv(ppVar134,&local_aa,sVar131);
            if (iVar44 == 0) {
              *(undefined8 *)(puVar107 + -8) = 3;
              sVar131 = *(size_t *)(puVar107 + -8);
              *(undefined8 *)(puVar107 + -8) = 0x11292f;
              iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar131);
              if (iVar44 == 0) {
                sVar131 = ppVar134->off;
                ppVar127 = emitter->buf;
                sVar133 = (tls->key_schedule->hashes[0].algo)->digest_size;
                *(undefined8 *)(puVar107 + -8) = 0x112957;
                iVar44 = ptls_buffer_reserve(ppVar127,sVar133);
                if (iVar44 == 0) {
                  puVar59 = emitter->buf->base;
                  sVar133 = emitter->buf->off;
                  sched = tls->key_schedule;
                  secret = &tls->traffic_protection;
                  if ((anon_struct_176_2_4ca0e81c_for_traffic_protection *)
                      tls->pending_handshake_secret !=
                      (anon_struct_176_2_4ca0e81c_for_traffic_protection *)0x0) {
                    secret = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)
                             tls->pending_handshake_secret;
                  }
                  *(undefined8 *)(puVar107 + -8) = 0x11298c;
                  iVar44 = calc_verify_data(puVar59 + sVar133,sched,secret);
                  if (iVar44 == 0) {
                    psVar3 = &emitter->buf->off;
                    *psVar3 = *psVar3 + (tls->key_schedule->hashes[0].algo)->digest_size;
                    uVar68 = ppVar134->off - sVar131;
                    *(undefined8 *)(puVar107 + -8) = 0x10;
                    for (lVar67 = *(long *)(puVar107 + -8); lVar67 != -8; lVar67 = lVar67 + -8) {
                      ppVar134->base[sVar131 - 3] = (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f));
                      sVar131 = sVar131 + 1;
                    }
                    if (ppVar55 != (ptls_key_schedule_t *)0x0) {
                      puVar59 = ppVar134->base;
                      sVar131 = ppVar134->off;
                      *(undefined8 *)(puVar107 + -8) = 0x1129f3;
                      ptls__key_schedule_update_hash(ppVar55,puVar59 + sVar130,sVar131 - sVar130);
                    }
                    emitter->buf->off = sVar130;
                    ppVar63 = tls->ctx;
                    *(undefined8 *)(puVar107 + -8) = 4;
                    sVar130 = *(size_t *)(puVar107 + -8);
                    p_Var22 = ppVar63->random_bytes;
                    *(undefined8 *)(puVar107 + -8) = 0x112a15;
                    (*p_Var22)(&ticket_server_name.len,sVar130);
                    uVar46 = (uint)ticket_server_name.len;
                    _auStack_a8 = (st_ptls_aead_algorithm_t *)&stack0xfffffffffffffd98;
                    session_id.capacity = 0;
                    session_id.base = (uint8_t *)0x80;
                    session_id.off._0_4_ = 0;
                    ppVar63 = tls->ctx;
                    ppVar55 = tls->key_schedule;
                    pcVar14 = tls->server_name;
                    session_id.is_allocated = (uint)tls->key_share->id;
                    uVar40 = tls->cipher_suite->id;
                    __s = tls->negotiated_protocol;
                    *(undefined8 *)(puVar107 + -8) = 2;
                    sVar130 = *(size_t *)(puVar107 + -8);
                    *(undefined8 *)(puVar107 + -8) = 0x112a8a;
                    iVar44 = ptls_buffer__do_pushv((ptls_buffer_t *)auStack_a8,"",sVar130);
                    sVar130 = session_id.capacity;
                    if (iVar44 == 0) {
                      *(undefined8 *)(puVar107 + -8) = 8;
                      sVar131 = *(size_t *)(puVar107 + -8);
                      *(undefined8 *)(puVar107 + -8) = 0x112ab0;
                      iVar44 = ptls_buffer__do_pushv((ptls_buffer_t *)auStack_a8,"ptls0001",sVar131)
                      ;
                      if (iVar44 == 0) {
                        psVar16 = ppVar63->get_time;
                        p_Var17 = psVar16->cb;
                        *(undefined8 *)(puVar107 + -8) = 0x112abe;
                        uVar56 = (*p_Var17)(psVar16);
                        auVar62 = (uint8_t  [8])
                                  (uVar56 >> 0x38 | (uVar56 & 0xff000000000000) >> 0x28 |
                                   (uVar56 & 0xff0000000000) >> 0x18 | (uVar56 & 0xff00000000) >> 8
                                   | (uVar56 & 0xff000000) << 8 | (uVar56 & 0xff0000) << 0x18 |
                                   (uVar56 & 0xff00) << 0x28 | uVar56 << 0x38);
                        local_100 = auVar62[0];
                        uStack_ff = auVar62[1];
                        uStack_fe = auVar62[2];
                        uStack_fd = auVar62[3];
                        uStack_fc = auVar62[4];
                        uStack_fb = auVar62[5];
                        uStack_fa = auVar62[6];
                        uStack_f9 = auVar62[7];
                        *(undefined8 *)(puVar107 + -8) = 8;
                        local_80 = *(size_t *)(puVar107 + -8);
                        *(undefined8 *)(puVar107 + -8) = 0x112ade;
                        iVar44 = ptls_buffer__do_pushv
                                           ((ptls_buffer_t *)auStack_a8,&stack0xffffffffffffff00,
                                            local_80);
                        if (iVar44 == 0) {
                          *(undefined8 *)(puVar107 + -8) = 2;
                          sVar131 = *(size_t *)(puVar107 + -8);
                          *(undefined8 *)(puVar107 + -8) = 0x112afc;
                          iVar44 = ptls_buffer__do_pushv((ptls_buffer_t *)auStack_a8,"",sVar131);
                          sVar131 = session_id.capacity;
                          if (iVar44 == 0) {
                            sVar133 = (ppVar55->hashes[0].algo)->digest_size;
                            *(undefined8 *)(puVar107 + -8) = 0x112b20;
                            iVar44 = ptls_buffer_reserve((ptls_buffer_t *)auStack_a8,sVar133);
                            sVar133 = session_id.capacity;
                            psVar4 = _auStack_a8;
                            if (iVar44 == 0) {
                              puVar59 = (uint8_t *)((long)&_auStack_a8->name + session_id.capacity);
                              *(undefined8 *)(puVar107 + -8) = 0x112b4d;
                              iVar44 = derive_resumption_secret
                                                 (ppVar55,puVar59,(ptls_iovec_t)ZEXT816(0));
                              if (iVar44 == 0) {
                                session_id.capacity =
                                     sVar133 + (ppVar55->hashes[0].algo)->digest_size;
                                lVar67 = session_id.capacity - sVar131;
                                *(uint8_t *)((long)psVar4 + (sVar131 - 2)) =
                                     (uint8_t)((ulong)lVar67 >> 8);
                                *(uint8_t *)((long)psVar4 + (sVar131 - 1)) = (uint8_t)lVar67;
                                local_f0._0_1_ = session_id.is_allocated._1_1_;
                                local_f0._1_1_ = (char)session_id.is_allocated;
                                *(undefined8 *)(puVar107 + -8) = 2;
                                sVar131 = *(size_t *)(puVar107 + -8);
                                *(undefined8 *)(puVar107 + -8) = 0x112b9c;
                                iVar44 = ptls_buffer__do_pushv
                                                   ((ptls_buffer_t *)auStack_a8,&local_f0,sVar131);
                                if (iVar44 == 0) {
                                  local_bc = CONCAT22(local_bc._2_2_,uVar40 << 8 | uVar40 >> 8);
                                  *(undefined8 *)(puVar107 + -8) = 2;
                                  sVar131 = *(size_t *)(puVar107 + -8);
                                  *(undefined8 *)(puVar107 + -8) = 0x112bc5;
                                  iVar44 = ptls_buffer__do_pushv
                                                     ((ptls_buffer_t *)auStack_a8,&local_bc,sVar131)
                                  ;
                                  if (iVar44 == 0) {
                                    local_1d8._0_4_ =
                                         uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 |
                                         (uVar46 & 0xff00) << 8 | uVar46 << 0x18;
                                    *(undefined8 *)(puVar107 + -8) = 4;
                                    sVar131 = *(size_t *)(puVar107 + -8);
                                    *(undefined8 *)(puVar107 + -8) = 0x112bea;
                                    iVar44 = ptls_buffer__do_pushv
                                                       ((ptls_buffer_t *)auStack_a8,local_1d8,
                                                        sVar131);
                                    if (iVar44 == 0) {
                                      *(undefined8 *)(puVar107 + -8) = 2;
                                      sVar131 = *(size_t *)(puVar107 + -8);
                                      *(undefined8 *)(puVar107 + -8) = 0x112c08;
                                      iVar44 = ptls_buffer__do_pushv
                                                         ((ptls_buffer_t *)auStack_a8,"",sVar131);
                                      sVar131 = session_id.capacity;
                                      if (iVar44 == 0) {
                                        sVar41 = (short)session_id.capacity;
                                        sVar42 = sVar41;
                                        if (pcVar14 != (char *)0x0) {
                                          *(undefined8 *)(puVar107 + -8) = 0x112c2d;
                                          sVar54 = strlen(pcVar14);
                                          *(undefined8 *)(puVar107 + -8) = 0x112c3f;
                                          iVar44 = ptls_buffer__do_pushv
                                                             ((ptls_buffer_t *)auStack_a8,pcVar14,
                                                              sVar54);
                                          if (iVar44 != 0) goto LAB_00112fb9;
                                          sVar42 = (short)session_id.capacity;
                                        }
                                        uVar40 = sVar42 - sVar41;
                                        *(ushort *)((long)_auStack_a8 + (sVar131 - 2)) =
                                             uVar40 * 0x100 | uVar40 >> 8;
                                        *(undefined8 *)(puVar107 + -8) = 1;
                                        sVar131 = *(size_t *)(puVar107 + -8);
                                        *(undefined8 *)(puVar107 + -8) = 0x112c74;
                                        iVar44 = ptls_buffer__do_pushv
                                                           ((ptls_buffer_t *)auStack_a8,"",sVar131);
                                        sVar131 = session_id.capacity;
                                        if (iVar44 == 0) {
                                          if (__s != (char *)0x0) {
                                            *(undefined8 *)(puVar107 + -8) = 0x112c99;
                                            sVar54 = strlen(__s);
                                            *(undefined8 *)(puVar107 + -8) = 0x112cab;
                                            iVar44 = ptls_buffer__do_pushv
                                                               ((ptls_buffer_t *)auStack_a8,__s,
                                                                sVar54);
                                            if (iVar44 != 0) goto LAB_00112fb9;
                                          }
                                          sVar133 = session_id.capacity;
                                          psVar4 = _auStack_a8;
                                          *(char *)((long)_auStack_a8 + (sVar131 - 1)) =
                                               (char)session_id.capacity - (char)sVar131;
                                          *(uint8_t *)((long)_auStack_a8 + (sVar130 - 2)) =
                                               (uint8_t)(session_id.capacity - sVar130 >> 8);
                                          *(uint8_t *)((long)_auStack_a8 + (sVar130 - 1)) =
                                               (uint8_t)(session_id.capacity - sVar130);
                                          p_Var21 = emitter->begin_message;
                                          *(undefined8 *)(puVar107 + -8) = 0x112ce9;
                                          iVar44 = (*p_Var21)(emitter);
                                          if (iVar44 == 0) {
                                            ppVar134 = emitter->buf;
                                            ppVar55 = tls->key_schedule;
                                            sVar130 = ppVar134->off;
                                            local_ca = 4;
                                            *(undefined8 *)(puVar107 + -8) = 1;
                                            sVar131 = *(size_t *)(puVar107 + -8);
                                            *(undefined8 *)(puVar107 + -8) = 0x112d21;
                                            iVar44 = ptls_buffer__do_pushv
                                                               (ppVar134,&local_ca,sVar131);
                                            if (iVar44 == 0) {
                                              *(undefined8 *)(puVar107 + -8) = 3;
                                              sVar131 = *(size_t *)(puVar107 + -8);
                                              *(undefined8 *)(puVar107 + -8) = 0x112d3b;
                                              iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar131);
                                              if (iVar44 == 0) {
                                                local_48 = (st_ptls_aead_algorithm_t *)ppVar134->off
                                                ;
                                                uVar46 = tls->ctx->ticket_lifetime;
                                                ppVar127 = emitter->buf;
                                                uVar46 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 |
                                                         (uVar46 & 0xff00) << 8 | uVar46 << 0x18;
                                                local_100 = (char)uVar46;
                                                uStack_ff = (char)(uVar46 >> 8);
                                                uStack_fe = (char)(uVar46 >> 0x10);
                                                uStack_fd = (char)(uVar46 >> 0x18);
                                                *(undefined8 *)(puVar107 + -8) = 4;
                                                sVar131 = *(size_t *)(puVar107 + -8);
                                                *(undefined8 *)(puVar107 + -8) = 0x112d6f;
                                                iVar44 = ptls_buffer__do_pushv
                                                                   (ppVar127,&
                                                  stack0xffffffffffffff00,sVar131);
                                                if (iVar44 == 0) {
                                                  ppVar127 = emitter->buf;
                                                  local_1d8._0_4_ =
                                                       (uint)ticket_server_name.len >> 0x18 |
                                                       ((uint)ticket_server_name.len & 0xff0000) >>
                                                       8 | ((uint)ticket_server_name.len & 0xff00)
                                                           << 8 |
                                                       (uint)ticket_server_name.len << 0x18;
                                                  *(undefined8 *)(puVar107 + -8) = 4;
                                                  sVar131 = *(size_t *)(puVar107 + -8);
                                                  *(undefined8 *)(puVar107 + -8) = 0x112d97;
                                                  iVar44 = ptls_buffer__do_pushv
                                                                     (ppVar127,local_1d8,sVar131);
                                                  if (iVar44 == 0) {
                                                    ppVar127 = emitter->buf;
                                                    *(undefined8 *)(puVar107 + -8) = 1;
                                                    sVar131 = *(size_t *)(puVar107 + -8);
                                                    *(undefined8 *)(puVar107 + -8) = 0x112db5;
                                                    iVar44 = ptls_buffer__do_pushv
                                                                       (ppVar127,"",sVar131);
                                                    if (iVar44 == 0) {
                                                      emitter->buf->base[emitter->buf->off - 1] =
                                                           '\0';
                                                      ppVar127 = emitter->buf;
                                                      *(undefined8 *)(puVar107 + -8) = 2;
                                                      sVar131 = *(size_t *)(puVar107 + -8);
                                                      *(undefined8 *)(puVar107 + -8) = 0x112de2;
                                                      iVar44 = ptls_buffer__do_pushv
                                                                         (ppVar127,"",sVar131);
                                                      if (iVar44 == 0) {
                                                        ppVar127 = emitter->buf;
                                                        sVar131 = ppVar127->off;
                                                        psVar18 = tls->ctx->encrypt_ticket;
                                                        *(undefined8 *)(puVar107 + -8) = 1;
                                                        uVar32 = *(undefined8 *)(puVar107 + -8);
                                                        p_Var19 = psVar18->cb;
                                                        *(undefined8 *)(puVar107 + -8) = 0x112e0c;
                                                        pVar139.len = sVar133;
                                                        pVar139.base = (uint8_t *)psVar4;
                                                        iVar44 = (*p_Var19)(psVar18,tls,(int)uVar32,
                                                                            ppVar127,pVar139);
                                                        if (iVar44 == 0) {
                                                          uVar68 = emitter->buf->off - sVar131;
                                                          for (; local_80 != 0xfffffffffffffff8;
                                                              local_80 = local_80 - 8) {
                                                            emitter->buf->base[sVar131 - 2] =
                                                                 (uint8_t)(uVar68 >>
                                                                          ((byte)local_80 & 0x3f));
                                                            sVar131 = sVar131 + 1;
                                                          }
                                                          ppVar127 = emitter->buf;
                                                          *(undefined8 *)(puVar107 + -8) = 2;
                                                          sVar131 = *(size_t *)(puVar107 + -8);
                                                          *(undefined8 *)(puVar107 + -8) = 0x112e67;
                                                          iVar44 = ptls_buffer__do_pushv
                                                                             (ppVar127,"",sVar131);
                                                          if (iVar44 == 0) {
                                                            ppVar127 = emitter->buf;
                                                            sVar131 = ppVar127->off;
                                                            sVar133 = sVar131;
                                                            if (tls->ctx->max_early_data_size == 0)
                                                            {
LAB_00112f38:
                                                              uVar68 = sVar133 - sVar131;
                                                              *(undefined8 *)(puVar107 + -8) = 8;
                                                              for (lVar67 = *(long *)(puVar107 + -8)
                                                                  ; lVar67 != -8;
                                                                  lVar67 = lVar67 + -8) {
                                                                emitter->buf->base[sVar131 - 2] =
                                                                     (uint8_t)(uVar68 >>
                                                                              ((byte)lVar67 & 0x3f))
                                                                ;
                                                                sVar131 = sVar131 + 1;
                                                              }
                                                              uVar68 = ppVar134->off -
                                                                       (long)local_48;
                                                              *(undefined8 *)(puVar107 + -8) = 0x10;
                                                              for (lVar67 = *(long *)(puVar107 + -8)
                                                                  ; lVar67 != -8;
                                                                  lVar67 = lVar67 + -8) {
                                                                ppVar134->base[(long)local_48 - 3] =
                                                                     (uint8_t)(uVar68 >>
                                                                              ((byte)lVar67 & 0x3f))
                                                                ;
                                                                local_48 = (st_ptls_aead_algorithm_t
                                                                            *)((long)local_48 + 1);
                                                              }
                                                              if (ppVar55 !=
                                                                  (ptls_key_schedule_t *)0x0) {
                                                                puVar59 = ppVar134->base;
                                                                sVar131 = ppVar134->off;
                                                                *(undefined8 *)(puVar107 + -8) =
                                                                     0x112fb2;
                                                                ptls__key_schedule_update_hash
                                                                          (ppVar55,puVar59 + sVar130
                                                                           ,sVar131 - sVar130);
                                                              }
                                                              p_Var21 = emitter->commit_message;
                                                              *(undefined8 *)(puVar107 + -8) =
                                                                   0x112fb9;
                                                              iVar44 = (*p_Var21)(emitter);
                                                            }
                                                            else {
                                                              local_bc = CONCAT22(local_bc._2_2_,
                                                                                  0x2a00);
                                                              *(undefined8 *)(puVar107 + -8) = 2;
                                                              sVar133 = *(size_t *)(puVar107 + -8);
                                                              *(undefined8 *)(puVar107 + -8) =
                                                                   0x112ea2;
                                                              iVar44 = ptls_buffer__do_pushv
                                                                                 (ppVar127,&local_bc
                                                                                  ,sVar133);
                                                              if (iVar44 == 0) {
                                                                ppVar127 = emitter->buf;
                                                                *(undefined8 *)(puVar107 + -8) = 2;
                                                                sVar133 = *(size_t *)(puVar107 + -8)
                                                                ;
                                                                *(undefined8 *)(puVar107 + -8) =
                                                                     0x112ec0;
                                                                iVar44 = ptls_buffer__do_pushv
                                                                                   (ppVar127,"",
                                                                                    sVar133);
                                                                if (iVar44 == 0) {
                                                                  ppVar127 = emitter->buf;
                                                                  sVar133 = ppVar127->off;
                                                                  uVar10 = tls->ctx->
                                                                           max_early_data_size;
                                                                  local_f0._1_1_ =
                                                                       (char)(uVar10 >> 0x10);
                                                                  local_f0._2_2_ =
                                                                       (ushort)(uVar10 >> 8) & 0xff
                                                                       | (ushort)((uVar10 << 0x18)
                                                                                 >> 0x10);
                                                                  local_f0._0_1_ =
                                                                       (undefined1)(uVar10 >> 0x18);
                                                                  *(undefined8 *)(puVar107 + -8) = 4
                                                                  ;
                                                                  sVar73 = *(size_t *)
                                                                            (puVar107 + -8);
                                                                  *(undefined8 *)(puVar107 + -8) =
                                                                       0x112ef0;
                                                                  iVar44 = ptls_buffer__do_pushv
                                                                                     (ppVar127,&
                                                  local_f0,sVar73);
                                                  if (iVar44 == 0) {
                                                    uVar68 = emitter->buf->off - sVar133;
                                                    *(undefined8 *)(puVar107 + -8) = 8;
                                                    for (lVar67 = *(long *)(puVar107 + -8);
                                                        lVar67 != -8; lVar67 = lVar67 + -8) {
                                                      emitter->buf->base[sVar133 - 2] =
                                                           (uint8_t)(uVar68 >> ((byte)lVar67 & 0x3f)
                                                                    );
                                                      sVar133 = sVar133 + 1;
                                                    }
                                                    sVar133 = emitter->buf->off;
                                                    goto LAB_00112f38;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
              *(undefined8 *)(puVar107 + -8) = 0x1128cf;
              __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                            ,0x596,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
            }
            ppVar55 = tls->key_schedule;
            local_ac = CONCAT11(local_ac._1_1_,5);
            *(undefined8 *)(puVar107 + -8) = 1;
            sVar131 = *(size_t *)(puVar107 + -8);
            *(undefined8 *)(puVar107 + -8) = 0x112835;
            iVar44 = ptls_buffer__do_pushv(ppVar134,&local_ac,sVar131);
            if (iVar44 == 0) {
              *(undefined8 *)(puVar107 + -8) = 3;
              sVar131 = *(size_t *)(puVar107 + -8);
              *(undefined8 *)(puVar107 + -8) = 0x11284f;
              iVar44 = ptls_buffer__do_pushv(ppVar134,"",sVar131);
              if (iVar44 == 0) {
                sVar131 = ppVar134->off;
                *(undefined8 *)(puVar107 + -8) = 0xfffffffffffffffd;
                for (lVar67 = *(long *)(puVar107 + -8); lVar67 != 0; lVar67 = lVar67 + 1) {
                  ppVar134->base[lVar67 + sVar131] = '\0';
                }
                if (ppVar55 != (ptls_key_schedule_t *)0x0) {
                  puVar59 = ppVar134->base;
                  sVar131 = ppVar134->off;
                  *(undefined8 *)(puVar107 + -8) = 0x1128e9;
                  ptls__key_schedule_update_hash(ppVar55,puVar59 + sVar130,sVar131 - sVar130);
                }
                ppVar134 = emitter->buf;
                ppVar134->off = sVar130;
                goto LAB_001128f4;
              }
            }
          }
LAB_00112fb9:
          *(undefined8 *)(puVar107 + -8) = 0x112fc8;
          ptls_buffer_dispose((ptls_buffer_t *)auStack_a8);
          psVar30 = tls->key_schedule->hashes[0].ctx;
          p_Var31 = psVar30->final;
          *(undefined8 *)(puVar107 + -8) = 0x112fdb;
          (*p_Var31)(psVar30,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
          tls->key_schedule->hashes[0].ctx = psVar61;
          if (iVar44 != 0) goto LAB_0010efba;
          ppVar63 = tls->ctx;
        }
        iVar44 = 0x202;
        if ((ppVar63->field_0x70 & 8) == 0) {
          iVar44 = 0;
        }
        goto LAB_0010efba;
      }
      uVar68 = *(ulong *)(__dest + 0x30);
      if (1 < uVar68) {
        uVar66 = (ulong)(ushort)(*puVar58 << 8 | *puVar58 >> 8);
        psStack_268 = (st_ptls_aead_algorithm_t *)(puVar58 + 1);
        if (uVar66 <= uVar68 - 2) {
          psVar48 = (st_ptls_aead_algorithm_t *)((long)puVar58 + uVar66 + 2);
          sStack_770 = 0x110744;
          iVar44 = select_key_share(&ppStack_188,(ptls_iovec_t *)&key_share,tls->ctx->key_exchanges,
                                    (uint8_t **)&stack0xfffffffffffffd98,(uint8_t *)psVar48,0);
          puVar75 = local_768;
          if (iVar44 != 0) goto LAB_0010efba;
          sStack_770 = 0x32;
          puVar75 = local_768;
          iVar44 = 0x32;
          if ((psStack_268 != psVar48) ||
             (puVar75 = local_768, iVar44 = 0x32,
             psStack_268 != (st_ptls_aead_algorithm_t *)((long)puVar58 + uVar68)))
          goto LAB_0010efba;
          goto LAB_0011005f;
        }
      }
LAB_0010fbb2:
      psVar74 = &sStack_770;
      sStack_770 = 0x32;
    }
  }
LAB_0010ef4c:
  puVar75 = (uint8_t *)(psVar74 + 1);
  iVar44 = (int)*psVar74;
LAB_0010efba:
  sVar130 = ticket_negotiated_protocol.len;
  puVar75[-8] = 0xc6;
  puVar75[-7] = 0xef;
  puVar75[-6] = '\x10';
  puVar75[-5] = '\0';
  puVar75[-4] = '\0';
  puVar75[-3] = '\0';
  puVar75[-2] = '\0';
  puVar75[-1] = '\0';
  free((void *)sVar130);
  puVar59 = ecdh_secret.base;
  auVar38 = auStack_168;
  if (auStack_168 != (undefined1  [8])0x0) {
    puVar75[-8] = 0xe2;
    puVar75[-7] = 0xef;
    puVar75[-6] = '\x10';
    puVar75[-5] = '\0';
    puVar75[-4] = '\0';
    puVar75[-3] = '\0';
    puVar75[-2] = '\0';
    puVar75[-1] = '\0';
    (*ptls_clear_memory)((void *)auVar38,(size_t)puVar59);
    auVar38 = auStack_168;
    puVar75[-8] = 0xee;
    puVar75[-7] = 0xef;
    puVar75[-6] = '\x10';
    puVar75[-5] = '\0';
    puVar75[-4] = '\0';
    puVar75[-3] = '\0';
    puVar75[-2] = '\0';
    puVar75[-1] = '\0';
    free((void *)auVar38);
  }
  puVar75[-8] = 0xf6;
  puVar75[-7] = 0xef;
  puVar75[-6] = '\x10';
  puVar75[-5] = '\0';
  puVar75[-4] = '\0';
  puVar75[-3] = '\0';
  puVar75[-2] = '\0';
  puVar75[-1] = '\0';
  free(__dest);
  return iVar44;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });       \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                    \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }